

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  short sVar1;
  short sVar2;
  _func_int *p_Var3;
  Layer *pLVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined4 uVar31;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined1 uVar36;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar42;
  undefined1 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  int n_2;
  ulong uVar48;
  undefined1 (*pauVar49) [16];
  short asVar50 [4];
  short asVar51 [4];
  uint uVar52;
  uint uVar53;
  undefined1 (*pauVar54) [16];
  short asVar55 [4];
  short asVar56 [4];
  long lVar57;
  ulong uVar58;
  long lVar59;
  undefined1 *puVar60;
  undefined1 (*pauVar61) [16];
  void *pvVar62;
  undefined1 (*pauVar63) [16];
  short asVar64 [4];
  ulong uVar65;
  int j_2;
  short asVar66 [4];
  int n;
  long lVar67;
  ulong uVar68;
  int iVar69;
  int iVar70;
  ulong uVar71;
  void *pvVar72;
  int *piVar73;
  int iVar74;
  long lVar75;
  short asVar76 [4];
  short asVar77 [4];
  short asVar78 [4];
  ulong uVar79;
  ulong uVar80;
  int j_1;
  uint uVar81;
  uint uVar82;
  undefined8 *puVar83;
  undefined8 *puVar84;
  short asVar85 [4];
  int *piVar86;
  int u_1;
  undefined1 *puVar87;
  short asVar88 [4];
  short asVar89 [4];
  int i;
  int iVar90;
  long lVar91;
  void *pvVar92;
  long lVar93;
  int v_1;
  uint uVar94;
  int iVar95;
  undefined1 *puVar96;
  void *pvVar97;
  int iVar98;
  long lVar99;
  void *pvVar100;
  long lVar101;
  ulong uVar102;
  ulong uVar103;
  int u_4;
  int iVar104;
  uint uVar105;
  undefined1 (*pauVar106) [16];
  short asVar107 [4];
  int i_2;
  int iVar108;
  ulong uVar109;
  short asVar110 [4];
  int u;
  uint uVar111;
  int iVar112;
  long lVar113;
  ulong uVar114;
  void *pvVar115;
  short asVar116 [4];
  short asVar117 [4];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  void *local_740;
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  int *local_6f8;
  void *local_6d8;
  Mat local_698;
  short local_648 [4];
  short local_640 [4];
  void *local_638;
  short local_630 [4];
  void *local_628;
  int *local_620;
  ulong local_618;
  void *local_610;
  short local_608 [4];
  short local_600 [4];
  Mat local_5f8;
  short d0 [4];
  Mat local_558;
  short local_510 [4];
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short d1 [4];
  Option opt_b;
  size_t local_458;
  short w3 [4];
  short local_420 [2];
  short local_41c [2];
  short w2 [4];
  short local_410 [2];
  short local_40c [2];
  short local_408 [4];
  ulong local_400;
  short local_3f8 [4];
  Mat *local_3f0;
  undefined1 auStack_3e8 [4];
  int local_3e4;
  int local_3e0;
  int local_3dc;
  short w1 [4];
  int aiStack_3d0 [2];
  Option opt_q;
  int aiStack_380 [2];
  undefined1 local_378 [16];
  undefined1 auStack_368 [80];
  undefined1 local_318 [16];
  undefined1 auStack_308 [80];
  undefined1 local_2b8 [16];
  undefined1 auStack_2a8 [80];
  undefined1 local_258 [16];
  undefined1 auStack_248 [96];
  undefined1 auStack_1e8 [96];
  undefined8 local_188;
  long local_180;
  long local_178;
  size_t local_170;
  undefined8 local_168;
  short local_160 [4];
  ulong local_158;
  int o0 [2];
  Mat local_148;
  short w0 [4];
  short d3 [4];
  short d2 [4];
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 uVar19;
  undefined3 uVar21;
  undefined2 uVar23;
  undefined3 uVar27;
  undefined2 uVar29;
  undefined4 uVar33;
  undefined3 uVar35;
  undefined2 uVar37;
  undefined3 uVar41;
  undefined2 uVar43;
  
  local_148.elempack = bottom_blob->elempack;
  local_148.elemsize = bottom_blob->elemsize;
  piVar86 = bottom_blob->refcount;
  local_148.data = bottom_blob->data;
  local_148.refcount = bottom_blob->refcount;
  local_148.allocator = bottom_blob->allocator;
  local_148.dims = bottom_blob->dims;
  local_148.w = bottom_blob->w;
  local_148.h = bottom_blob->h;
  local_148.d = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar86 != (int *)0x0) {
    LOCK();
    *piVar86 = *piVar86 + 1;
    UNLOCK();
  }
  if (local_148.elempack == 0 || ((int)local_148.elemsize * 8) / local_148.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar9 = opt->openmp_blocktime;
    uVar10 = opt->use_winograd_convolution;
    uVar12 = opt->use_sgemm_convolution;
    uVar14 = opt->use_int8_inference;
    uVar16 = opt->use_vulkan_compute;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.workspace_allocator._4_4_ = (int)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar9;
    opt_q._28_4_ = uVar11;
    quantize_to_int8(bottom_blob,&local_148,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx[-3]),&opt_q)
    ;
  }
  local_698.cstep = 0;
  local_698.data = (void *)0x0;
  local_698.refcount._0_4_ = 0;
  local_698.refcount._4_4_ = 0;
  local_698.elemsize = 0;
  local_698.elempack = 0;
  local_698.allocator = (Allocator *)0x0;
  local_698.dims = 0;
  local_698.w = 0;
  local_698.h = 0;
  local_698.d = 0;
  local_698.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx + (long)this->_vptr_Convolution_x86_avx[-3]),
             &local_148,&local_698,opt);
  iVar70 = local_698.elempack;
  iVar90 = -100;
  if ((local_698.data == (void *)0x0) || (local_698.cstep * (long)local_698.c == 0))
  goto LAB_00244190;
  p_Var3 = this->_vptr_Convolution_x86_avx[-3];
  uVar82 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
  iVar104 = (~((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) + -1) *
              *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data)) + local_698.w) /
            *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) + 1;
  iVar98 = (~((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data)) + local_698.h) /
           *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) + 1;
  iVar95 = *(int *)(p_Var3 + 0x20 + (long)&(this->weight_winograd43_data).data);
  if (opt->use_packing_layout == true) {
    if (iVar95 < 0x65) {
      uVar81 = (uint)((uVar82 & 3) == 0) * 3 + 1;
    }
    else {
      uVar81 = 1;
      if ((uVar82 & 7) == 0) {
        uVar81 = 8;
      }
    }
  }
  else {
    uVar81 = 1;
  }
  uVar94 = uVar81 * 4;
  if (100 < iVar95) {
    uVar94 = uVar81;
  }
  local_600 = (short  [4])(long)local_698.c;
  Mat::create(top_blob,iVar104,iVar98,(int)uVar82 / (int)uVar81,(ulong)uVar94,uVar81,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00244190;
  if (opt->use_packing_layout == true) {
    local_630._0_4_ =
         (uint)(((byte)(this->_vptr_Convolution_x86_avx[-3] + 0x30)
                       [(long)&(this->weight_winograd23_data).data] & 3) == 0) * 3 + 1;
    local_630[2] = 0;
    local_630[3] = 0;
  }
  else {
    local_630[0] = 1;
    local_630[1] = 0;
    local_630[2] = 0;
    local_630[3] = 0;
  }
  local_5f8.cstep = 0;
  local_5f8.data = (void *)0x0;
  local_5f8.refcount._0_4_ = 0;
  local_5f8.refcount._4_4_ = 0;
  local_5f8.elemsize = 0;
  local_5f8.elempack = 0;
  local_5f8.allocator = (Allocator *)0x0;
  local_5f8.dims = 0;
  local_5f8.w = 0;
  local_5f8.h = 0;
  local_5f8.d = 0;
  local_5f8.c = 0;
  iVar90 = local_630._0_4_;
  local_3f0 = top_blob;
  local_3dc = iVar95;
  Mat::create(&local_5f8,iVar104,iVar98,
              *(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data) / iVar90,(ulong)(uint)(iVar90 * 4)
              ,iVar90,opt->workspace_allocator);
  iVar98 = local_5f8.c;
  uVar94 = local_5f8.h;
  uVar81 = local_5f8.w;
  uVar82 = local_698.c;
  iVar95 = local_698.w;
  iVar90 = -100;
  if (((short  [4])local_5f8.data != (short  [4])0x0) && (local_5f8.cstep * (long)local_5f8.c != 0))
  {
    if ((iVar70 != 8) || (local_630._0_4_ != 4)) goto LAB_00241e07;
    p_Var3 = this->_vptr_Convolution_x86_avx[-3];
    uVar105 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
    uVar48 = (ulong)uVar105;
    if ((uVar105 == 1) &&
       (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
      if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
         (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))) {
        conv1x1s1_sgemm_pack8to4_int8_sse(&local_698,&local_5f8,&this->weight_sgemm_data,opt);
        goto LAB_002440af;
      }
      if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
          (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
         ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
          (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2)))) goto LAB_002417da;
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator._0_4_ = 0;
      opt_q.workspace_allocator._4_4_ = 0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
      Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_698.c,local_698.elemsize,
                  local_698.elempack,opt->workspace_allocator);
      uVar71 = 0;
      uVar48 = (ulong)uVar81;
      if ((int)uVar81 < 1) {
        uVar48 = uVar71;
      }
      uVar109 = (ulong)uVar94;
      if ((int)uVar94 < 1) {
        uVar109 = uVar71;
      }
      uVar114 = (ulong)uVar82;
      if ((int)uVar82 < 1) {
        uVar114 = uVar71;
      }
      for (; uVar71 != uVar114; uVar71 = uVar71 + 1) {
        puVar83 = (undefined8 *)
                  (local_698.cstep * uVar71 * local_698.elemsize + (long)local_698.data);
        puVar84 = (undefined8 *)opt_q._0_8_;
        for (iVar90 = 0; uVar80 = uVar48, iVar90 != (int)uVar109; iVar90 = iVar90 + 1) {
          while (iVar98 = (int)uVar80, uVar80 = (ulong)(iVar98 - 1), iVar98 != 0) {
            *puVar84 = *puVar83;
            puVar83 = puVar83 + 2;
            puVar84 = puVar84 + 1;
          }
          puVar83 = puVar83 + (int)((iVar95 - uVar81) * 2);
        }
      }
      conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
      piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar86 != (int *)0x0) {
        LOCK();
        *piVar86 = *piVar86 + -1;
        UNLOCK();
        if (*piVar86 == 0) {
          if (opt_q._32_8_ == 0) {
LAB_0024426d:
            free((void *)opt_q._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
LAB_00241e07:
      iVar104 = local_5f8.c;
      uVar82 = local_5f8.h;
      iVar98 = local_5f8.w;
      iVar95 = local_698.c;
      iVar90 = local_698.w;
      if ((iVar70 == 1) && (local_630._0_4_ == 4)) {
        p_Var3 = this->_vptr_Convolution_x86_avx[-3];
        uVar81 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar48 = (ulong)uVar81;
        uVar45 = local_718._8_8_;
        if (uVar81 == 7) {
          if ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))))
          goto LAB_00242699;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,0x31,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar71 = 0;
          uVar48 = (ulong)uVar82;
          if ((int)uVar82 < 1) {
            uVar48 = uVar71;
          }
          uVar109 = (ulong)(uint)iVar95;
          if (iVar95 < 1) {
            uVar109 = uVar71;
          }
          for (; uVar71 != uVar109; uVar71 = uVar71 + 1) {
            local_718._0_8_ = uVar71;
            lVar75 = opt_q._0_8_;
            for (lVar91 = 0; lVar91 != 7; lVar91 = lVar91 + 1) {
              for (lVar57 = 0; lVar57 != 7; lVar57 = lVar57 + 1) {
                puVar60 = (undefined1 *)
                          ((long)local_698.data +
                          lVar57 + (long)local_698.w * local_698.elemsize * lVar91 +
                                   local_698.cstep * uVar71 * local_698.elemsize);
                for (iVar95 = 0; iVar95 != (int)uVar48; iVar95 = iVar95 + 1) {
                  puVar87 = puVar60 + (iVar90 - iVar98) * 2;
                  puVar96 = puVar60;
                  for (lVar101 = 0; (int)lVar101 + 3 < iVar98; lVar101 = lVar101 + 4) {
                    *(undefined1 *)(lVar75 + lVar101) = *puVar96;
                    *(undefined1 *)(lVar75 + 1 + lVar101) = puVar96[2];
                    *(undefined1 *)(lVar75 + 2 + lVar101) = puVar96[4];
                    *(undefined1 *)(lVar75 + 3 + lVar101) = puVar96[6];
                    puVar96 = puVar96 + 8;
                    puVar87 = puVar87 + 8;
                  }
                  for (; (int)lVar101 + 1 < iVar98; lVar101 = lVar101 + 2) {
                    *(undefined1 *)(lVar75 + lVar101) = *puVar96;
                    *(undefined1 *)(lVar75 + 1 + lVar101) = puVar96[2];
                    puVar96 = puVar96 + 4;
                    puVar87 = puVar87 + 4;
                  }
                  for (; (int)lVar101 < iVar98; lVar101 = lVar101 + 1) {
                    *(undefined1 *)(lVar75 + lVar101) = puVar60[lVar101 * 2];
                    puVar87 = puVar87 + 2;
                  }
                  lVar75 = lVar75 + lVar101;
                  puVar60 = puVar87;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_00244450;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar81 == 3) {
          if (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3)
          goto LAB_00242699;
          if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)))) {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_00242699;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,9,local_698.c,1,1,
                        opt->workspace_allocator);
            uVar71 = 0;
            uVar48 = (ulong)uVar82;
            if ((int)uVar82 < 1) {
              uVar48 = uVar71;
            }
            uVar109 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar109 = uVar71;
            }
            for (; uVar71 != uVar109; uVar71 = uVar71 + 1) {
              local_718._0_8_ = uVar71;
              lVar75 = opt_q._0_8_;
              for (lVar91 = 0; lVar91 != 3; lVar91 = lVar91 + 1) {
                for (lVar57 = 0; lVar57 != 3; lVar57 = lVar57 + 1) {
                  puVar60 = (undefined1 *)
                            ((long)local_698.data +
                            lVar57 + (long)local_698.w * local_698.elemsize * lVar91 +
                                     local_698.cstep * uVar71 * local_698.elemsize);
                  for (iVar95 = 0; iVar95 != (int)uVar48; iVar95 = iVar95 + 1) {
                    puVar87 = puVar60 + (iVar90 - iVar98) * 2;
                    puVar96 = puVar60;
                    for (lVar101 = 0; (int)lVar101 + 3 < iVar98; lVar101 = lVar101 + 4) {
                      *(undefined1 *)(lVar75 + lVar101) = *puVar96;
                      *(undefined1 *)(lVar75 + 1 + lVar101) = puVar96[2];
                      *(undefined1 *)(lVar75 + 2 + lVar101) = puVar96[4];
                      *(undefined1 *)(lVar75 + 3 + lVar101) = puVar96[6];
                      puVar96 = puVar96 + 8;
                      puVar87 = puVar87 + 8;
                    }
                    for (; (int)lVar101 + 1 < iVar98; lVar101 = lVar101 + 2) {
                      *(undefined1 *)(lVar75 + lVar101) = *puVar96;
                      *(undefined1 *)(lVar75 + 1 + lVar101) = puVar96[2];
                      puVar96 = puVar96 + 4;
                      puVar87 = puVar87 + 4;
                    }
                    for (; (int)lVar101 < iVar98; lVar101 = lVar101 + 1) {
                      *(undefined1 *)(lVar75 + lVar101) = puVar60[lVar101 * 2];
                      puVar87 = puVar87 + 2;
                    }
                    lVar75 = lVar75 + lVar101;
                    puVar60 = puVar87;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
            piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar86 != (int *)0x0) {
              LOCK();
              *piVar86 = *piVar86 + -1;
              UNLOCK();
              if (*piVar86 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_00244450;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_00242bf6;
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,9,local_698.c,1,1,
                      opt->workspace_allocator);
          local_718._0_8_ = &this->weight_sgemm_data;
          uVar71 = 0;
          uVar48 = (ulong)uVar82;
          if ((int)uVar82 < 1) {
            uVar48 = uVar71;
          }
          uVar109 = (ulong)(uint)iVar95;
          if (iVar95 < 1) {
            uVar109 = uVar71;
          }
          for (; uVar71 != uVar109; uVar71 = uVar71 + 1) {
            lVar75 = opt_q._0_8_;
            for (lVar91 = 0; lVar91 != 3; lVar91 = lVar91 + 1) {
              for (lVar57 = 0; lVar57 != 3; lVar57 = lVar57 + 1) {
                lVar101 = (long)local_698.data +
                          lVar57 + (long)local_698.w * local_698.elemsize * lVar91 +
                                   local_698.cstep * uVar71 * local_698.elemsize;
                for (iVar95 = 0; iVar95 != (int)uVar48; iVar95 = iVar95 + 1) {
                  for (lVar93 = 0; (int)lVar93 + 3 < iVar98; lVar93 = lVar93 + 4) {
                    *(undefined1 *)(lVar75 + lVar93) = *(undefined1 *)(lVar101 + lVar93);
                    *(undefined1 *)(lVar75 + 1 + lVar93) = *(undefined1 *)(lVar101 + 1 + lVar93);
                    *(undefined1 *)(lVar75 + 2 + lVar93) = *(undefined1 *)(lVar101 + 2 + lVar93);
                    *(undefined1 *)(lVar75 + 3 + lVar93) = *(undefined1 *)(lVar101 + 3 + lVar93);
                  }
                  for (; (int)lVar93 + 1 < iVar98; lVar93 = lVar93 + 2) {
                    *(undefined1 *)(lVar75 + lVar93) = *(undefined1 *)(lVar101 + lVar93);
                    *(undefined1 *)(lVar75 + 1 + lVar93) = *(undefined1 *)(lVar101 + 1 + lVar93);
                  }
                  for (; (int)lVar93 < iVar98; lVar93 = lVar93 + 1) {
                    *(undefined1 *)(lVar75 + lVar93) = *(undefined1 *)(lVar101 + lVar93);
                  }
                  lVar101 = lVar101 + (iVar90 - iVar98) + lVar93;
                  lVar75 = lVar75 + lVar93;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 == (int *)0x0) goto LAB_00242bf6;
          LOCK();
          *piVar86 = *piVar86 + -1;
          UNLOCK();
          if (*piVar86 != 0) goto LAB_00242bf6;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_00242bf6;
          }
LAB_00244450:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar81 == 1) &&
             (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
            if (((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                ((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_698,&local_5f8,&this->weight_sgemm_data,opt);
              goto LAB_002440af;
            }
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 2)) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_698.c,local_698.elemsize,
                          local_698.elempack,opt->workspace_allocator);
              uVar48 = 0;
              if ((int)uVar82 < 1) {
                uVar82 = 0;
              }
              uVar71 = (ulong)(uint)iVar95;
              if (iVar95 < 1) {
                uVar71 = uVar48;
              }
              for (; uVar48 != uVar71; uVar48 = uVar48 + 1) {
                puVar60 = (undefined1 *)
                          (local_698.cstep * uVar48 * local_698.elemsize + (long)local_698.data);
                lVar75 = opt_q._0_8_;
                for (uVar81 = 0; uVar81 != uVar82; uVar81 = uVar81 + 1) {
                  puVar87 = puVar60 + (iVar90 - iVar98) * 2;
                  puVar96 = puVar60;
                  for (lVar91 = 0; (int)lVar91 + 3 < iVar98; lVar91 = lVar91 + 4) {
                    *(undefined1 *)(lVar75 + lVar91) = *puVar96;
                    *(undefined1 *)(lVar75 + 1 + lVar91) = puVar96[2];
                    *(undefined1 *)(lVar75 + 2 + lVar91) = puVar96[4];
                    *(undefined1 *)(lVar75 + 3 + lVar91) = puVar96[6];
                    puVar96 = puVar96 + 8;
                    puVar87 = puVar87 + 8;
                  }
                  for (; (int)lVar91 + 1 < iVar98; lVar91 = lVar91 + 2) {
                    *(undefined1 *)(lVar75 + lVar91) = *puVar96;
                    *(undefined1 *)(lVar75 + 1 + lVar91) = puVar96[2];
                    puVar96 = puVar96 + 4;
                    puVar87 = puVar87 + 4;
                  }
                  for (; (int)lVar91 < iVar98; lVar91 = lVar91 + 1) {
                    *(undefined1 *)(lVar75 + lVar91) = puVar60[lVar91 * 2];
                    puVar87 = puVar87 + 2;
                  }
                  lVar75 = lVar75 + lVar91;
                  puVar60 = puVar87;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar86 != (int *)0x0) {
                LOCK();
                *piVar86 = *piVar86 + -1;
                UNLOCK();
                if (*piVar86 == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_00244450;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_00242bf6;
            }
          }
LAB_00242699:
          uVar94 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
          iVar69 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
          local_718._0_8_ = (long)iVar69;
          iVar108 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
          iVar112 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
          lVar75 = (long)iVar112;
          iVar74 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
          lVar91 = (long)local_5f8.w;
          uVar105 = uVar94 * uVar81;
          if (opt->use_sgemm_convolution == true) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar105,local_698.c,1,1,
                        opt->workspace_allocator);
            local_640 = (short  [4])&this->weight_sgemm_data;
            lVar91 = (long)(iVar112 * 2);
            uVar71 = 0;
            if ((int)uVar82 < 1) {
              uVar82 = 0;
            }
            if ((int)uVar81 < 1) {
              uVar48 = uVar71;
            }
            uVar109 = (ulong)uVar94;
            if ((int)uVar94 < 1) {
              uVar109 = uVar71;
            }
            uVar114 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar114 = uVar71;
            }
            for (; uVar71 != uVar114; uVar71 = uVar71 + 1) {
              lVar57 = opt_q._0_8_;
              for (uVar80 = 0; uVar80 != uVar109; uVar80 = uVar80 + 1) {
                for (uVar103 = 0; uVar103 != uVar48; uVar103 = uVar103 + 1) {
                  puVar60 = (undefined1 *)
                            ((long)local_698.data +
                            uVar103 * (long)iVar69 +
                            (long)local_698.w * local_698.elemsize * (long)iVar108 * uVar80 +
                            local_698.cstep * uVar71 * local_698.elemsize);
                  for (uVar81 = 0; uVar81 != uVar82; uVar81 = uVar81 + 1) {
                    lVar93 = 0;
                    puVar87 = puVar60;
                    for (lVar101 = 0; (int)lVar101 + 3 < iVar98; lVar101 = lVar101 + 4) {
                      *(undefined1 *)(lVar57 + lVar101) = *puVar87;
                      *(undefined1 *)(lVar57 + 1 + lVar101) = puVar87[lVar75];
                      *(undefined1 *)(lVar57 + 2 + lVar101) = puVar87[lVar91];
                      *(undefined1 *)(lVar57 + 3 + lVar101) = puVar87[iVar112 * 3];
                      puVar87 = puVar87 + iVar112 * 4;
                      lVar93 = lVar93 + iVar112 * 4;
                    }
                    for (; (int)lVar101 + 1 < iVar98; lVar101 = lVar101 + 2) {
                      *(undefined1 *)(lVar57 + lVar101) = *puVar87;
                      *(undefined1 *)(lVar57 + 1 + lVar101) = puVar87[lVar75];
                      puVar87 = puVar87 + lVar91;
                      lVar93 = lVar93 + lVar91;
                    }
                    for (; (int)lVar101 < iVar98; lVar101 = lVar101 + 1) {
                      *(undefined1 *)(lVar57 + lVar101) = puVar60[lVar93];
                      lVar93 = lVar93 + lVar75;
                    }
                    puVar60 = puVar60 + lVar93 + (iVar90 * iVar74 - iVar98 * iVar112);
                    lVar57 = lVar57 + lVar101;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_5f8,(Mat *)local_640,opt);
            piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar86 != (int *)0x0) {
              LOCK();
              *piVar86 = *piVar86 + -1;
              UNLOCK();
              if (*piVar86 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_00244450;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar71 = (ulong)(uint)local_5f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar105,
                       (allocator_type *)&local_558);
            local_728._0_4_ = iVar90 * iVar108 - iVar69 * uVar81;
            uVar53 = 0;
            if ((int)uVar81 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar94 < 1) {
              uVar94 = 0;
            }
            iVar112 = (int)uVar48;
            iVar108 = 0;
            iVar90 = 0;
            for (; uVar53 != uVar94; uVar53 = uVar53 + 1) {
              for (lVar57 = (long)iVar90; (int)uVar48 != lVar57; lVar57 = lVar57 + 1) {
                *(int *)(opt_q._0_8_ + lVar57 * 4) = iVar108;
                iVar108 = iVar108 + iVar69;
              }
              iVar108 = iVar108 + local_728._0_4_;
              uVar48 = (ulong)(uint)((int)uVar48 + iVar112);
              iVar90 = iVar90 + iVar112;
            }
            uVar109 = 0;
            uVar48 = (ulong)uVar105;
            if ((int)uVar105 < 1) {
              uVar48 = uVar109;
            }
            uVar114 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar114 = uVar109;
            }
            uVar80 = 0;
            if (0 < iVar98) {
              uVar80 = (ulong)(uint)iVar98;
            }
            local_718._0_8_ = uVar80;
            local_718 = CONCAT88(uVar45,local_718._0_8_);
            uVar103 = (ulong)uVar82;
            if ((int)uVar82 < 1) {
              uVar103 = uVar109;
            }
            if (iVar104 < 1) {
              uVar71 = uVar109;
            }
            for (; uVar109 != uVar71; uVar109 = uVar109 + 1) {
              local_728._0_8_ =
                   (Mat *)(local_5f8.cstep * uVar109 * local_5f8.elemsize + (long)local_5f8.data);
              for (uVar58 = 0; uVar58 != uVar103; uVar58 = uVar58 + 1) {
                for (uVar65 = 0; uVar65 != uVar80; uVar65 = uVar65 + 1) {
                  pvVar72 = (void *)((this->weight_data_tm).cstep * uVar109 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  auVar132 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar68 = 0; uVar68 != uVar114; uVar68 = uVar68 + 1) {
                    for (uVar79 = 0; uVar48 != uVar79; uVar79 = uVar79 + 1) {
                      auVar120 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_698.data +
                                                                          (long)*(int *)(opt_q._0_8_
                                                                                        + uVar79 * 4
                                                                                        ) +
                                                                          local_698.cstep *
                                                                          local_698.elemsize *
                                                                          uVar68 + uVar65 * lVar75 +
                                                                                   (long)local_698.w
                                                                                   * uVar58 * (long)
                                                  iVar74 * local_698.elemsize)),0);
                      auVar137 = vpshufd_avx(auVar120,0);
                      auVar135._8_8_ = 0;
                      auVar135._0_8_ = *(ulong *)((long)pvVar72 + uVar79 * 4);
                      auVar120 = vpcmpgtb_avx((undefined1  [16])0x0,auVar135);
                      auVar120 = vpunpcklbw_avx(auVar135,auVar120);
                      auVar129 = vpmullw_avx(auVar137,auVar120);
                      auVar120 = vpmulhw_avx(auVar137,auVar120);
                      auVar120 = vpunpcklwd_avx(auVar129,auVar120);
                      auVar120 = vpaddd_avx(auVar132._0_16_,auVar120);
                      auVar132 = ZEXT1664(auVar120);
                    }
                    pvVar72 = (void *)((long)pvVar72 + uVar48 * 4);
                  }
                  *(undefined1 (*) [16])(local_728._0_8_ + uVar65 * 0x10) = auVar132._0_16_;
                }
                local_728._0_8_ = local_728._0_8_ + lVar91 * 0x10;
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_00242bf6:
      iVar104 = local_5f8.c;
      uVar82 = local_5f8.h;
      iVar98 = local_5f8.w;
      sVar5 = local_698.cstep;
      iVar95 = local_698.c;
      iVar90 = local_698.w;
      if ((iVar70 == 8) && (local_630._0_4_ == 1)) {
        p_Var3 = this->_vptr_Convolution_x86_avx[-3];
        uVar81 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar48 = (ulong)uVar81;
        if ((uVar81 == 1) &&
           (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_698,&local_5f8,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_00242e7d;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar71 = 0;
            uVar48 = (ulong)(uint)iVar98;
            if (iVar98 < 1) {
              uVar48 = uVar71;
            }
            if ((int)uVar82 < 1) {
              uVar82 = 0;
            }
            uVar109 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar109 = uVar71;
            }
            for (; uVar71 != uVar109; uVar71 = uVar71 + 1) {
              puVar83 = (undefined8 *)
                        (local_698.cstep * uVar71 * local_698.elemsize + (long)local_698.data);
              puVar84 = (undefined8 *)opt_q._0_8_;
              for (uVar81 = 0; uVar114 = uVar48, uVar81 != uVar82; uVar81 = uVar81 + 1) {
                while (iVar70 = (int)uVar114, uVar114 = (ulong)(iVar70 - 1), iVar70 != 0) {
                  *puVar84 = *puVar83;
                  puVar83 = puVar83 + 2;
                  puVar84 = puVar84 + 1;
                }
                puVar83 = puVar83 + (iVar90 - iVar98) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt)
            ;
            piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar86 != (int *)0x0) {
              LOCK();
              *piVar86 = *piVar86 + -1;
              UNLOCK();
              if (*piVar86 == 0) {
                pvVar72 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_00247aa9;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_00242e7d:
          if (((opt->use_winograd_convolution == true) && (uVar81 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
                 (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
                (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))))))) {
            iVar90 = cpu_support_x86_avx2();
            if (iVar90 == 0) {
              iVar98 = cpu_support_x86_xop();
              iVar95 = local_5f8.c;
              iVar70 = local_698.c;
              iVar90 = local_698.elempack;
              if (iVar98 == 0) {
                auVar118._4_4_ = local_5f8.h;
                auVar118._0_4_ = local_5f8.w;
                uVar48 = (ulong)local_5f8.c;
                piVar86 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
                local_558.data = local_698.data;
                local_558.refcount._0_4_ = local_698.refcount._0_4_;
                local_558.refcount._4_4_ = local_698.refcount._4_4_;
                local_558.elemsize = local_698.elemsize;
                local_558.elempack = local_698.elempack;
                local_558.allocator = local_698.allocator;
                local_558.d = local_698.d;
                local_558.h = local_698.h;
                local_558.dims = local_698.dims;
                local_558.w = local_698.w;
                local_558.c = local_698.c;
                local_558.cstep = local_698.cstep;
                if (piVar86 != (int *)0x0) {
                  LOCK();
                  *piVar86 = *piVar86 + 1;
                  UNLOCK();
                }
                auVar128._8_4_ = 3;
                auVar128._0_8_ = 0x300000003;
                auVar128._12_4_ = 3;
                auVar118._8_8_ = 0;
                auVar120 = vpaddd_avx(auVar118,auVar128);
                auVar129 = vpsrad_avx(auVar120,0x1f);
                auVar129 = vpsrld_avx(auVar129,0x1e);
                auVar120 = vpaddd_avx(auVar120,auVar129);
                auVar132 = ZEXT1664(auVar120);
                auVar119._8_4_ = 0xfffffffc;
                auVar119._0_8_ = 0xfffffffcfffffffc;
                auVar119._12_4_ = 0xfffffffc;
                auVar129 = vpand_avx(auVar120,auVar119);
                local_620 = (int *)(ulong)auVar129._4_4_;
                iVar69 = auVar129._0_4_;
                copy_make_border(&local_698,&local_558,0,(auVar129._4_4_ + 2) - local_698.h,0,
                                 (iVar69 + 2) - local_698.w,0,0.0,opt);
                auVar120 = vpsrad_avx(auVar120,2);
                uVar82 = auVar120._0_4_;
                uVar81 = auVar120._4_4_;
                local_630._0_4_ = uVar82 * 6;
                iVar98 = uVar82 * 6 * uVar81;
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                iVar104 = (int)((long)iVar98 / 6);
                Mat::create((Mat *)d0,iVar104,0x24,iVar70,(ulong)(uint)(iVar90 * 2),iVar90,
                            opt->workspace_allocator);
                uVar71 = 0;
                if ((int)uVar82 < 1) {
                  uVar82 = 0;
                }
                if ((int)uVar81 < 1) {
                  uVar81 = 0;
                }
                local_600[2] = 0;
                local_600[3] = 0;
                local_600[0] = (short)uVar81;
                local_600[1] = (short)(uVar81 >> 0x10);
                uVar109 = 0;
                if (0 < iVar70) {
                  uVar109 = (ulong)(uint)iVar70;
                }
                auVar121._8_4_ = 0xfffbfffb;
                auVar121._0_8_ = 0xfffbfffbfffbfffb;
                auVar121._12_4_ = 0xfffbfffb;
                for (; auVar120 = auVar132._0_16_, uVar71 != uVar109; uVar71 = uVar71 + 1) {
                  pauVar106 = (undefined1 (*) [16])
                              ((long)local_558.data +
                              local_558.cstep * local_558.elemsize * uVar71 + 0x20);
                  asVar55[0] = 0;
                  asVar55[1] = 0;
                  asVar55[2] = 0;
                  asVar55[3] = 0;
                  for (; asVar55 != local_600; asVar55 = (short  [4])((long)asVar55 + 1)) {
                    pauVar49 = (undefined1 (*) [16])
                               ((long)((local_630._0_4_ * asVar55._0_4_) / 6) * 0x10 + (long)d0);
                    pauVar63 = pauVar106;
                    for (uVar114 = 0; lVar75 = -0x60, pauVar61 = pauVar63, uVar114 != uVar82;
                        uVar114 = uVar114 + 1) {
                      for (; pauVar54 = pauVar49, lVar91 = 0x50, lVar75 != 0; lVar75 = lVar75 + 0x10
                          ) {
                        auVar120 = pauVar61[-2];
                        auVar137 = pauVar61[-1];
                        auVar141 = *pauVar61;
                        auVar130 = vpcmpgtb_avx((undefined1  [16])0x0,auVar120);
                        auVar131 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                        auVar127 = vpcmpgtb_avx((undefined1  [16])0x0,auVar141);
                        auVar139 = vpunpcklbw_avx(auVar120,auVar130);
                        auVar142 = vpunpckhbw_avx(auVar120,auVar130);
                        auVar130 = vpunpcklbw_avx(auVar137,auVar131);
                        auVar131 = vpunpckhbw_avx(auVar137,auVar131);
                        auVar135 = vpunpcklbw_avx(auVar141,auVar127);
                        auVar140 = vpunpckhbw_avx(auVar141,auVar127);
                        auVar120 = vpsllw_avx(auVar139,2);
                        auVar120 = vpaddw_avx(auVar120,auVar135);
                        auVar137 = vpmullw_avx(auVar130,auVar121);
                        auVar120 = vpaddw_avx(auVar120,auVar137);
                        auVar137 = vpaddw_avx(auVar135,auVar131);
                        auVar141 = vpaddw_avx(auVar130,auVar142);
                        auVar141 = vpsllw_avx(auVar141,2);
                        auVar127 = vpsubw_avx(auVar137,auVar141);
                        auVar137 = vpsubw_avx(auVar135,auVar131);
                        auVar141 = vpsubw_avx(auVar142,auVar130);
                        auVar141 = vpsllw_avx(auVar141,2);
                        auVar137 = vpaddw_avx(auVar137,auVar141);
                        auVar130 = vpsubw_avx(auVar135,auVar130);
                        auVar141 = vpsubw_avx(auVar142,auVar131);
                        auVar141 = vpaddw_avx(auVar141,auVar141);
                        auVar139 = vpsubw_avx(auVar130,auVar141);
                        auVar141 = vpaddw_avx(auVar130,auVar141);
                        auVar130 = vpsllw_avx(auVar142,2);
                        auVar130 = vpaddw_avx(auVar130,auVar140);
                        auVar131 = vpmullw_avx(auVar131,auVar121);
                        auVar130 = vpaddw_avx(auVar130,auVar131);
                        auVar132 = ZEXT1664(auVar130);
                        *(undefined1 (*) [16])(auStack_368 + lVar75) = auVar120;
                        *(undefined1 (*) [16])(auStack_308 + lVar75) = auVar127;
                        *(undefined1 (*) [16])(auStack_2a8 + lVar75) = auVar137;
                        *(undefined1 (*) [16])(auStack_248 + lVar75) = auVar139;
                        *(undefined1 (*) [16])(auStack_1e8 + lVar75) = auVar141;
                        *(undefined1 (*) [16])((long)&local_188 + lVar75) = auVar130;
                        pauVar61 = (undefined1 (*) [16])(*pauVar61 + (iVar69 + 2) * 8);
                      }
                      for (; lVar91 != 0x290; lVar91 = lVar91 + 0x60) {
                        auVar120 = *(undefined1 (*) [16])((long)local_408 + lVar91);
                        auVar137 = *(undefined1 (*) [16])((long)local_3f8 + lVar91);
                        auVar141 = *(undefined1 (*) [16])(auStack_3e8 + lVar91);
                        auVar130 = *(undefined1 (*) [16])((long)w1 + lVar91);
                        auVar131 = vpsllw_avx(*(undefined1 (*) [16])((long)w2 + lVar91),2);
                        auVar127 = vpmullw_avx(auVar137,auVar121);
                        auVar131 = vpaddw_avx(auVar131,auVar130);
                        auVar131 = vpaddw_avx(auVar127,auVar131);
                        auVar132 = ZEXT1664(auVar131);
                        auVar127 = vpaddw_avx(auVar130,auVar141);
                        auVar139 = vpaddw_avx(auVar137,auVar120);
                        auVar139 = vpsllw_avx(auVar139,2);
                        auVar139 = vpsubw_avx(auVar127,auVar139);
                        auVar127 = vpsubw_avx(auVar130,auVar141);
                        auVar142 = vpsubw_avx(auVar120,auVar137);
                        auVar142 = vpsllw_avx(auVar142,2);
                        auVar127 = vpaddw_avx(auVar142,auVar127);
                        auVar130 = vpsubw_avx(auVar130,auVar137);
                        auVar137 = vpsubw_avx(auVar120,auVar141);
                        auVar137 = vpaddw_avx(auVar137,auVar137);
                        auVar142 = vpsubw_avx(auVar130,auVar137);
                        auVar137 = vpaddw_avx(auVar130,auVar137);
                        auVar130 = vpsllw_avx(auVar120,2);
                        auVar120 = vpmullw_avx(auVar141,auVar121);
                        auVar120 = vpaddw_avx(auVar120,auVar130);
                        auVar120 = vpaddw_avx(auVar120,*(undefined1 (*) [16])
                                                        (&opt_q.lightmode + lVar91));
                        *pauVar54 = auVar131;
                        *(undefined1 (*) [16])(*pauVar54 + (long)(iVar104 * 8) * 2) = auVar139;
                        *(undefined1 (*) [16])(*pauVar54 + (long)(iVar104 << 4) * 2) = auVar127;
                        *(undefined1 (*) [16])(*pauVar54 + (long)(iVar104 * 0x18) * 2) = auVar142;
                        *(undefined1 (*) [16])(*pauVar54 + (long)(iVar104 << 5) * 2) = auVar137;
                        *(undefined1 (*) [16])(*pauVar54 + (long)(iVar104 * 0x28) * 2) = auVar120;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + (long)(iVar104 * 0x30) * 2);
                      }
                      pauVar63 = pauVar63 + 2;
                      pauVar49 = pauVar49 + 1;
                    }
                    pauVar106 = (undefined1 (*) [16])
                                (*pauVar106 + (long)local_558.w * local_558.elemsize * 4);
                  }
                }
                piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
                if (piVar86 != (int *)0x0) {
                  LOCK();
                  *piVar86 = *piVar86 + -1;
                  UNLOCK();
                  if (*piVar86 == 0) {
                    if (local_558.allocator == (Allocator *)0x0) {
                      free(local_558.data);
                    }
                    else {
                      (*(local_558.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_558.cstep = 0;
                local_558.data = (void *)0x0;
                local_558.refcount._0_4_ = 0;
                local_558.refcount._4_4_ = 0;
                local_558.elemsize = 0;
                local_558.elempack = 0;
                local_558.h = 0;
                local_558.d = 0;
                local_558.c = 0;
                local_558.allocator = (Allocator *)0x0;
                local_558.dims = 0;
                local_558.w = 0;
                d1[0] = 0;
                d1[1] = 0;
                d1[2] = 0;
                d1[3] = 0;
                opt_q.workspace_allocator._0_4_ = 0;
                opt_q.workspace_allocator._4_4_ = 0;
                opt_q.openmp_blocktime = 0;
                opt_q.lightmode = false;
                opt_q._1_3_ = 0;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
                iVar108 = 0;
                if (0xb < iVar98) {
                  iVar108 = (int)(((long)iVar98 / 6 & 0xffffffffU) >> 1);
                }
                opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
                Mat::create((Mat *)&opt_q,iVar70 << (0xb < iVar98),iVar104 - iVar108,0x24,
                            (ulong)(uint)(iVar90 * 2),iVar90,opt->workspace_allocator);
                lVar91 = (long)iVar104;
                for (lVar75 = 0; lVar75 != 0x24; lVar75 = lVar75 + 1) {
                  lVar57 = (long)(int)opt_q._44_4_ *
                           CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_)
                  ;
                  for (uVar71 = 0; (long)(uVar71 | 1) < lVar91; uVar71 = uVar71 + 2) {
                    puVar84 = (undefined8 *)((uVar71 >> 1) * lVar57 + opt_q._0_8_);
                    puVar83 = (undefined8 *)((uVar71 + lVar75 * lVar91) * 0x10 + (long)d0);
                    uVar114 = uVar109;
                    while (iVar90 = (int)uVar114, uVar114 = (ulong)(iVar90 - 1), iVar90 != 0) {
                      uVar45 = puVar83[1];
                      uVar46 = puVar83[2];
                      uVar47 = puVar83[3];
                      *puVar84 = *puVar83;
                      puVar84[1] = uVar45;
                      puVar84[2] = uVar46;
                      puVar84[3] = uVar47;
                      puVar84 = puVar84 + 4;
                    }
                  }
                  for (; (long)uVar71 < lVar91; uVar71 = uVar71 + 1) {
                    puVar84 = (undefined8 *)
                              ((ulong)(((uint)uVar71 & 1) + ((uint)(uVar71 >> 1) & 0x7fffffff)) *
                               lVar57 + opt_q._0_8_);
                    puVar83 = (undefined8 *)((uVar71 + lVar75 * lVar91) * 0x10 + (long)d0);
                    uVar114 = uVar109;
                    while (iVar90 = (int)uVar114, uVar114 = (ulong)(iVar90 - 1), iVar90 != 0) {
                      uVar45 = puVar83[1];
                      *puVar84 = *puVar83;
                      puVar84[1] = uVar45;
                      puVar84 = puVar84 + 2;
                    }
                  }
                }
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                auVar132 = ZEXT1664(auVar120);
                Mat::create((Mat *)d1,iVar104,0x24,iVar95,4,1,opt->workspace_allocator);
                local_608._0_4_ = iVar95 >> 2;
                local_648[0] = d1[0];
                local_648[1] = d1[1];
                local_648[2] = d1[2];
                local_648[3] = d1[3];
                local_628 = (void *)0x0;
                pvVar72 = (this->weight_winograd43_data).data;
                local_610 = (void *)(this->weight_winograd43_data).elemsize;
                local_638 = (void *)opt_q._0_8_;
                asVar89[0] = 0;
                asVar89[1] = 0;
                asVar89[2] = 0;
                asVar89[3] = 0;
                local_608[2] = 0;
                local_608[3] = 0;
                if ((int)local_608._0_4_ < 1) {
                  local_608 = asVar89;
                }
                local_618 = (this->weight_winograd43_data).cstep * (long)local_610;
                while (asVar78 = asVar89, asVar78 != local_608) {
                  iVar90 = (this->weight_winograd43_data).w;
                  asVar51 = d1;
                  pvVar62 = pvVar72;
                  asVar77 = d1;
                  asVar85 = d1;
                  asVar117 = d1;
                  for (lVar75 = 0; lVar75 != 0x24; lVar75 = lVar75 + 1) {
                    lVar101 = (long)(int)opt_q._44_4_ *
                              CONCAT44(opt_q.workspace_allocator._4_4_,
                                       opt_q.workspace_allocator._0_4_);
                    lVar57 = opt_q._0_8_;
                    for (uVar71 = 0; (long)(uVar71 | 1) < lVar91; uVar71 = uVar71 + 2) {
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      lVar93 = 0;
                      auVar136 = ZEXT1664((undefined1  [16])0x0);
                      auVar134 = ZEXT1664((undefined1  [16])0x0);
                      auVar138 = ZEXT1664((undefined1  [16])0x0);
                      uVar114 = uVar109;
                      while( true ) {
                        iVar70 = (int)uVar114;
                        uVar114 = (ulong)(iVar70 - 1);
                        if (iVar70 == 0) break;
                        auVar120 = *(undefined1 (*) [16])(lVar57 + lVar93);
                        auVar137 = *(undefined1 (*) [16])(lVar57 + 0x10 + lVar93);
                        auVar141 = *(undefined1 (*) [16])((long)pvVar62 + lVar93 * 2);
                        auVar130 = *(undefined1 (*) [16])((long)pvVar62 + lVar93 * 2 + 0x10);
                        auVar131 = *(undefined1 (*) [16])((long)pvVar62 + lVar93 * 2 + 0x20);
                        auVar142 = vpunpcklwd_avx(auVar120,auVar120);
                        auVar127 = vpshuflw_avx(auVar120,0x50);
                        auVar140 = vpunpcklwd_avx(auVar137,auVar137);
                        auVar139 = vpshuflw_avx(auVar137,0x50);
                        auVar127 = vpshufd_avx(auVar127,0x50);
                        auVar133 = vpmullw_avx(auVar127,auVar141);
                        auVar127 = vpmulhw_avx(auVar127,auVar141);
                        auVar139 = vpshufd_avx(auVar139,0x50);
                        auVar118 = vpmullw_avx(auVar139,auVar141);
                        auVar139 = vpmulhw_avx(auVar139,auVar141);
                        auVar141 = vpshufd_avx(auVar142,0xfa);
                        auVar119 = vpmullw_avx(auVar141,auVar130);
                        auVar142 = vpmulhw_avx(auVar141,auVar130);
                        auVar141 = vpshufd_avx(auVar140,0xfa);
                        auVar128 = vpmullw_avx(auVar141,auVar130);
                        auVar140 = vpmulhw_avx(auVar141,auVar130);
                        auVar141 = vpunpckhwd_avx(auVar120,auVar120);
                        auVar141 = vpshufd_avx(auVar141,0x50);
                        auVar121 = vpmullw_avx(auVar131,auVar141);
                        auVar135 = vpmulhw_avx(auVar131,auVar141);
                        auVar141 = vpunpckhwd_avx(auVar137,auVar137);
                        auVar141 = vpshufd_avx(auVar141,0x50);
                        auVar124 = vpmullw_avx(auVar131,auVar141);
                        auVar122 = vpmulhw_avx(auVar131,auVar141);
                        auVar120 = vpshufhw_avx(auVar120,0xfa);
                        auVar141 = vpshufhw_avx(auVar137,0xfa);
                        auVar137 = vpshufd_avx(auVar120,0xfa);
                        auVar120 = *(undefined1 (*) [16])((long)pvVar62 + lVar93 * 2 + 0x30);
                        auVar7 = vpmullw_avx(auVar120,auVar137);
                        auVar123 = vpmulhw_avx(auVar120,auVar137);
                        auVar137 = vpshufd_avx(auVar141,0xfa);
                        auVar8 = vpmullw_avx(auVar120,auVar137);
                        auVar126 = vpmulhw_avx(auVar120,auVar137);
                        auVar120 = vpunpcklwd_avx(auVar133,auVar127);
                        auVar120 = vpaddd_avx(auVar120,auVar138._0_16_);
                        auVar137 = vpunpckhwd_avx(auVar133,auVar127);
                        auVar137 = vpaddd_avx(auVar137,auVar134._0_16_);
                        auVar141 = vpunpcklwd_avx(auVar118,auVar139);
                        auVar141 = vpaddd_avx(auVar141,auVar136._0_16_);
                        auVar130 = vpunpckhwd_avx(auVar118,auVar139);
                        auVar130 = vpaddd_avx(auVar130,auVar125._0_16_);
                        auVar131 = vpunpcklwd_avx(auVar119,auVar142);
                        auVar127 = vpunpckhwd_avx(auVar119,auVar142);
                        auVar142 = vpunpcklwd_avx(auVar128,auVar140);
                        auVar139 = vpunpckhwd_avx(auVar128,auVar140);
                        auVar140 = vpunpcklwd_avx(auVar121,auVar135);
                        auVar131 = vpaddd_avx(auVar131,auVar140);
                        auVar120 = vpaddd_avx(auVar120,auVar131);
                        auVar131 = vpunpckhwd_avx(auVar121,auVar135);
                        auVar131 = vpaddd_avx(auVar127,auVar131);
                        auVar137 = vpaddd_avx(auVar137,auVar131);
                        auVar131 = vpunpcklwd_avx(auVar124,auVar122);
                        auVar131 = vpaddd_avx(auVar142,auVar131);
                        auVar141 = vpaddd_avx(auVar141,auVar131);
                        auVar131 = vpunpckhwd_avx(auVar124,auVar122);
                        auVar131 = vpaddd_avx(auVar139,auVar131);
                        auVar130 = vpaddd_avx(auVar130,auVar131);
                        auVar132 = ZEXT1664(auVar130);
                        auVar131 = vpunpcklwd_avx(auVar7,auVar123);
                        auVar120 = vpaddd_avx(auVar120,auVar131);
                        auVar138 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar7,auVar123);
                        auVar120 = vpaddd_avx(auVar137,auVar120);
                        auVar134 = ZEXT1664(auVar120);
                        auVar120 = vpunpcklwd_avx(auVar8,auVar126);
                        auVar120 = vpaddd_avx(auVar141,auVar120);
                        auVar136 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar8,auVar126);
                        auVar120 = vpaddd_avx(auVar130,auVar120);
                        auVar125 = ZEXT1664(auVar120);
                        lVar93 = lVar93 + 0x20;
                      }
                      auVar120 = vpaddd_avx(auVar138._0_16_,auVar134._0_16_);
                      *(int *)asVar85 = auVar120._0_4_;
                      *(int *)asVar77 = auVar120._4_4_;
                      *(int *)asVar117 = auVar120._8_4_;
                      *(int *)asVar51 = auVar120._12_4_;
                      auVar120 = vpaddd_avx(auVar136._0_16_,auVar125._0_16_);
                      *(int *)((long)asVar85 + 4) = auVar120._0_4_;
                      *(int *)((long)asVar77 + 4) = auVar120._4_4_;
                      *(int *)((long)asVar117 + 4) = auVar120._8_4_;
                      *(int *)((long)asVar51 + 4) = auVar120._12_4_;
                      asVar85 = (short  [4])((long)asVar85 + 8);
                      asVar77 = (short  [4])((long)asVar77 + 8);
                      asVar117 = (short  [4])((long)asVar117 + 8);
                      asVar51 = (short  [4])((long)asVar51 + 8);
                      lVar57 = lVar57 + lVar101;
                    }
                    while (uVar81 = (uint)uVar71, (int)uVar81 < iVar104) {
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      lVar57 = 0;
                      auVar132 = ZEXT1664((undefined1  [16])0x0);
                      uVar114 = uVar109;
                      while( true ) {
                        iVar70 = (int)uVar114;
                        uVar114 = (ulong)(iVar70 - 1);
                        if (iVar70 == 0) break;
                        auVar120 = *(undefined1 (*) [16])
                                    ((ulong)((uVar81 & 1) + ((uint)(uVar71 >> 1) & 0x7fffffff)) *
                                     lVar101 + opt_q._0_8_ + lVar57);
                        auVar137 = *(undefined1 (*) [16])((long)pvVar62 + lVar57 * 4);
                        auVar141 = *(undefined1 (*) [16])((long)pvVar62 + lVar57 * 4 + 0x10);
                        auVar130 = *(undefined1 (*) [16])((long)pvVar62 + lVar57 * 4 + 0x20);
                        auVar131 = *(undefined1 (*) [16])((long)pvVar62 + lVar57 * 4 + 0x30);
                        auVar139 = vpunpcklwd_avx(auVar120,auVar120);
                        auVar127 = vpshuflw_avx(auVar120,0x50);
                        auVar140 = vpshufhw_avx(auVar120,0xfa);
                        auVar142 = vpunpckhwd_avx(auVar120,auVar120);
                        auVar120 = vpshufd_avx(auVar127,0x50);
                        auVar127 = vpmullw_avx(auVar120,auVar137);
                        auVar137 = vpmulhw_avx(auVar120,auVar137);
                        auVar120 = vpshufd_avx(auVar139,0xfa);
                        auVar139 = vpmullw_avx(auVar141,auVar120);
                        auVar141 = vpmulhw_avx(auVar141,auVar120);
                        auVar120 = vpshufd_avx(auVar142,0x50);
                        auVar142 = vpmullw_avx(auVar130,auVar120);
                        auVar130 = vpmulhw_avx(auVar130,auVar120);
                        auVar120 = vpshufd_avx(auVar140,0xfa);
                        auVar140 = vpmullw_avx(auVar131,auVar120);
                        auVar131 = vpmulhw_avx(auVar131,auVar120);
                        auVar120 = vpunpcklwd_avx(auVar127,auVar137);
                        auVar120 = vpaddd_avx(auVar132._0_16_,auVar120);
                        auVar137 = vpunpckhwd_avx(auVar127,auVar137);
                        auVar137 = vpaddd_avx(auVar125._0_16_,auVar137);
                        auVar135 = vpunpcklwd_avx(auVar139,auVar141);
                        auVar127 = vpunpckhwd_avx(auVar139,auVar141);
                        auVar141 = vpunpcklwd_avx(auVar142,auVar130);
                        auVar141 = vpaddd_avx(auVar135,auVar141);
                        auVar120 = vpaddd_avx(auVar120,auVar141);
                        auVar141 = vpunpckhwd_avx(auVar142,auVar130);
                        auVar141 = vpaddd_avx(auVar127,auVar141);
                        auVar137 = vpaddd_avx(auVar137,auVar141);
                        auVar141 = vpunpcklwd_avx(auVar140,auVar131);
                        auVar120 = vpaddd_avx(auVar120,auVar141);
                        auVar132 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar140,auVar131);
                        auVar120 = vpaddd_avx(auVar137,auVar120);
                        auVar125 = ZEXT1664(auVar120);
                        lVar57 = lVar57 + 0x10;
                      }
                      auVar120 = vpaddd_avx(auVar132._0_16_,auVar125._0_16_);
                      *(int *)asVar85 = auVar120._0_4_;
                      *(int *)asVar77 = auVar120._4_4_;
                      *(int *)asVar117 = auVar120._8_4_;
                      *(int *)asVar51 = auVar120._12_4_;
                      asVar85 = (short  [4])((long)asVar85 + 4);
                      asVar77 = (short  [4])((long)asVar77 + 4);
                      asVar117 = (short  [4])((long)asVar117 + 4);
                      asVar51 = (short  [4])((long)asVar51 + 4);
                      uVar71 = (ulong)(uVar81 + 1);
                    }
                    pvVar62 = (void *)((long)pvVar62 + (long)iVar90 * (long)local_610);
                  }
                  pvVar72 = (void *)((long)pvVar72 + local_618);
                  local_640 = asVar78;
                  asVar89 = (short  [4])((long)asVar78 + 1);
                }
                pvVar72 = (this->weight_winograd43_data).data;
                sVar5 = (this->weight_winograd43_data).elemsize;
                sVar6 = (this->weight_winograd43_data).cstep;
                for (uVar71 = uVar48 & 0xfffffffffffffffc; auVar120 = auVar132._0_16_,
                    (long)uVar71 < (long)uVar48; uVar71 = uVar71 + 1) {
                  uVar114 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 | uVar71 & 0xffffffff;
                  iVar90 = (this->weight_winograd43_data).w;
                  pvVar62 = (void *)((long)((int)((long)uVar114 % 4) + (int)((long)uVar114 / 4)) *
                                     sVar6 * sVar5 + (long)pvVar72);
                  asVar78 = d1;
                  for (lVar75 = 0; lVar75 != 0x24; lVar75 = lVar75 + 1) {
                    lVar101 = (long)(int)opt_q._44_4_ *
                              CONCAT44(opt_q.workspace_allocator._4_4_,
                                       opt_q.workspace_allocator._0_4_);
                    lVar57 = opt_q._0_8_;
                    for (uVar114 = 0; (long)(uVar114 | 1) < lVar91; uVar114 = uVar114 + 2) {
                      auVar132 = ZEXT1664((undefined1  [16])0x0);
                      lVar93 = 0;
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      auVar134 = ZEXT1664((undefined1  [16])0x0);
                      auVar136 = ZEXT1664((undefined1  [16])0x0);
                      uVar80 = uVar109;
                      while( true ) {
                        iVar70 = (int)uVar80;
                        uVar80 = (ulong)(iVar70 - 1);
                        if (iVar70 == 0) break;
                        auVar120 = *(undefined1 (*) [16])(lVar57 + lVar93 * 2);
                        auVar137 = *(undefined1 (*) [16])(lVar57 + 0x10 + lVar93 * 2);
                        auVar141 = *(undefined1 (*) [16])((long)pvVar62 + lVar93);
                        auVar131 = vpmullw_avx(auVar141,auVar120);
                        auVar130 = vpmulhw_avx(auVar120,auVar141);
                        auVar127 = vpmullw_avx(auVar141,auVar137);
                        auVar137 = vpmulhw_avx(auVar137,auVar141);
                        auVar120 = vpunpcklwd_avx(auVar131,auVar130);
                        auVar120 = vpaddd_avx(auVar132._0_16_,auVar120);
                        auVar132 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar131,auVar130);
                        auVar120 = vpaddd_avx(auVar125._0_16_,auVar120);
                        auVar125 = ZEXT1664(auVar120);
                        auVar120 = vpunpcklwd_avx(auVar127,auVar137);
                        auVar120 = vpaddd_avx(auVar134._0_16_,auVar120);
                        auVar134 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar127,auVar137);
                        auVar120 = vpaddd_avx(auVar136._0_16_,auVar120);
                        auVar136 = ZEXT1664(auVar120);
                        lVar93 = lVar93 + 0x10;
                      }
                      auVar120 = vpaddd_avx(auVar125._0_16_,auVar132._0_16_);
                      auVar137 = vpaddd_avx(auVar136._0_16_,auVar134._0_16_);
                      auVar141 = vpshufd_avx(auVar120,0xee);
                      auVar120 = vpaddd_avx(auVar120,auVar141);
                      auVar141 = vpshufd_avx(auVar137,0xee);
                      auVar137 = vpaddd_avx(auVar137,auVar141);
                      auVar132 = ZEXT1664(auVar137);
                      auVar120 = vphaddd_avx(auVar120,auVar137);
                      auVar120 = vpshufd_avx(auVar120,0xe8);
                      *(long *)asVar78 = auVar120._0_8_;
                      asVar78 = (short  [4])((long)asVar78 + 8);
                      lVar57 = lVar57 + lVar101;
                    }
                    while (uVar81 = (uint)uVar114, (int)uVar81 < iVar104) {
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      lVar57 = 0;
                      auVar132 = ZEXT1664((undefined1  [16])0x0);
                      uVar80 = uVar109;
                      while( true ) {
                        iVar70 = (int)uVar80;
                        uVar80 = (ulong)(iVar70 - 1);
                        if (iVar70 == 0) break;
                        auVar120 = *(undefined1 (*) [16])
                                    ((ulong)((uVar81 & 1) + ((uint)(uVar114 >> 1) & 0x7fffffff)) *
                                     lVar101 + opt_q._0_8_ + lVar57);
                        auVar141 = vpmullw_avx(*(undefined1 (*) [16])((long)pvVar62 + lVar57),
                                               auVar120);
                        auVar137 = vpmulhw_avx(auVar120,*(undefined1 (*) [16])
                                                         ((long)pvVar62 + lVar57));
                        auVar120 = vpunpcklwd_avx(auVar141,auVar137);
                        auVar120 = vpaddd_avx(auVar125._0_16_,auVar120);
                        auVar125 = ZEXT1664(auVar120);
                        auVar120 = vpunpckhwd_avx(auVar141,auVar137);
                        auVar120 = vpaddd_avx(auVar132._0_16_,auVar120);
                        auVar132 = ZEXT1664(auVar120);
                        lVar57 = lVar57 + 0x10;
                      }
                      auVar120 = vpaddd_avx(auVar132._0_16_,auVar125._0_16_);
                      auVar120 = vphaddd_avx(auVar120,auVar120);
                      auVar120 = vphaddd_avx(auVar120,auVar120);
                      *(int *)asVar78 = auVar120._0_4_;
                      asVar78 = (short  [4])((long)asVar78 + 4);
                      uVar114 = (ulong)(uVar81 + 1);
                    }
                    pvVar62 = (void *)((long)pvVar62 + (long)iVar90 * sVar5);
                  }
                }
                piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar86 != (int *)0x0) {
                  LOCK();
                  *piVar86 = *piVar86 + -1;
                  UNLOCK();
                  if (*piVar86 == 0) {
                    if (opt_q._32_8_ == 0) {
                      free((void *)opt_q._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      auVar125._8_56_ = extraout_var_00;
                      auVar125._0_8_ = extraout_XMM1_Qa_00;
                      auVar120 = auVar125._0_16_;
                    }
                  }
                }
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                opt_b.lightmode = false;
                opt_b._1_3_ = 0;
                opt_b.num_threads = 0;
                opt_b.blob_allocator._0_4_ = 0;
                opt_b.blob_allocator._4_4_ = 0;
                opt_b.workspace_allocator = (Allocator *)0x0;
                opt_b.openmp_blocktime = 0;
                opt_b.use_bf16_storage = false;
                opt_b.use_fp16_packed = false;
                opt_b.use_fp16_storage = false;
                opt_b.use_fp16_arithmetic = false;
                opt_b.use_int8_packed = false;
                opt_b.use_int8_storage = false;
                opt_b.use_int8_arithmetic = false;
                opt_b.use_packing_layout = false;
                opt_b.use_shader_pack8 = false;
                opt_b.use_subgroup_basic = false;
                opt_b.use_subgroup_vote = false;
                opt_b.use_subgroup_ballot = false;
                opt_b.use_subgroup_shuffle = false;
                opt_b.use_image_storage = false;
                opt_b.use_tensor_storage = false;
                opt_b.use_reserved_0 = false;
                opt_b.flush_denormals = 0;
                opt_b.use_local_pool_allocator = false;
                opt_b.use_shader_local_memory = false;
                opt_b.use_cooperative_matrix = false;
                opt_b.use_winograd23_convolution = false;
                opt_b.use_winograd43_convolution = false;
                opt_b.use_winograd63_convolution = false;
                opt_b.use_reserved_6 = false;
                opt_b.use_reserved_7 = false;
                auVar124._4_4_ = local_5f8.h;
                auVar124._0_4_ = local_5f8.w;
                auVar124._8_8_ = 0;
                auVar129 = vpcmpeqd_avx(auVar124,auVar129);
                auVar129 = vpmovsxdq_avx(auVar129);
                auVar120 = vpcmpeqd_avx(auVar120,auVar120);
                if (((auVar120 & ~auVar129) >> 0x3f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 && -1 < SUB161(auVar120 & ~auVar129,0xf)) {
                  piVar86 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
                  if (piVar86 != (int *)0x0) {
                    LOCK();
                    *piVar86 = *piVar86 + 1;
                    UNLOCK();
                  }
                  opt_b._0_8_ = local_5f8.data;
                  opt_b.blob_allocator._0_4_ = local_5f8.refcount._0_4_;
                  opt_b.blob_allocator._4_4_ = local_5f8.refcount._4_4_;
                  opt_b.workspace_allocator = (Allocator *)local_5f8.elemsize;
                  opt_b.openmp_blocktime = local_5f8.elempack;
                  opt_b._32_8_ = local_5f8.allocator;
                  opt_b.use_shader_pack8 = (bool)(undefined1)local_5f8.dims;
                  opt_b.use_subgroup_basic = (bool)local_5f8.dims._1_1_;
                  opt_b.use_subgroup_vote = (bool)local_5f8.dims._2_1_;
                  opt_b.use_subgroup_ballot = (bool)local_5f8.dims._3_1_;
                  opt_b.use_subgroup_shuffle = (bool)(undefined1)local_5f8.w;
                  opt_b.use_image_storage = (bool)local_5f8.w._1_1_;
                  opt_b.use_tensor_storage = (bool)local_5f8.w._2_1_;
                  opt_b.use_reserved_0 = (bool)local_5f8.w._3_1_;
                  opt_b.flush_denormals = local_5f8.h;
                  opt_b.use_local_pool_allocator = (bool)(undefined1)local_5f8.d;
                  opt_b.use_shader_local_memory = (bool)local_5f8.d._1_1_;
                  opt_b.use_cooperative_matrix = (bool)local_5f8.d._2_1_;
                  opt_b.use_winograd23_convolution = (bool)local_5f8.d._3_1_;
                  opt_b.use_winograd43_convolution = (bool)(undefined1)local_5f8.c;
                  opt_b.use_winograd63_convolution = (bool)local_5f8.c._1_1_;
                  opt_b.use_reserved_6 = (bool)local_5f8.c._2_1_;
                  opt_b.use_reserved_7 = (bool)local_5f8.c._3_1_;
                  local_510[0] = (undefined2)local_5f8.cstep;
                  local_510[1] = local_5f8.cstep._2_2_;
                  local_510[2] = local_5f8.cstep._4_2_;
                  local_510[3] = local_5f8.cstep._6_2_;
                }
                else {
                  Mat::create((Mat *)&opt_b,iVar69,(int)local_620,iVar95,4,1,
                              opt->workspace_allocator);
                  local_510[0] = 0;
                  local_510[1] = 0;
                  local_510[2] = 0;
                  local_510[3] = 0;
                }
                uVar48 = (ulong)(uint)iVar95;
                if (iVar95 < 1) {
                  uVar48 = 0;
                }
                local_3f8[0] = 0;
                local_3f8[1] = 0;
                local_3f8[2] = 0;
                local_3f8[3] = 0;
                lVar75 = (long)(iVar104 * 6) * 4;
                local_648 = (short  [4])((long)d1 + lVar91 * 4);
                local_628 = (void *)((long)d1 + (long)(iVar104 * 2) * 4);
                local_610 = (void *)((long)d1 + (long)(iVar104 * 3) * 4);
                local_638 = (void *)((long)d1 + (long)(iVar104 * 4) * 4);
                local_608[0] = d1[0];
                local_608[1] = d1[1];
                local_608[2] = d1[2];
                local_608[3] = d1[3];
                local_618 = (long)d1 + (long)(iVar104 * 5) * 4;
                local_620 = (int *)(opt_b._0_8_ + 0xc);
                local_510 = (short  [4])((long)local_510 * (long)opt_b.workspace_allocator);
                local_408 = (short  [4])((long)opt_b.workspace_allocator * 4);
                for (uVar71 = 0; uVar71 != uVar48; uVar71 = uVar71 + 1) {
                  local_6f8 = local_620;
                  asVar64[0] = 0;
                  asVar64[1] = 0;
                  asVar64[2] = 0;
                  asVar64[3] = 0;
                  while (asVar78 = asVar64, asVar78 != local_600) {
                    lVar91 = (long)((local_630._0_4_ * asVar78._0_4_) / 6);
                    asVar51 = d1;
                    uVar109 = local_618;
                    uVar114 = (ulong)local_628;
                    uVar80 = (ulong)local_638;
                    piVar86 = local_6f8;
                    uVar103 = (ulong)local_610;
                    asVar77 = local_648;
                    for (uVar58 = 0; uVar58 != uVar82; uVar58 = uVar58 + 1) {
                      asVar85 = asVar51;
                      uVar65 = uVar109;
                      uVar68 = uVar114;
                      uVar79 = uVar80;
                      uVar102 = uVar103;
                      asVar117 = asVar77;
                      for (lVar57 = -5; lVar57 != 0; lVar57 = lVar57 + 1) {
                        iVar95 = *(int *)((long)asVar117 + lVar91 * 4);
                        iVar70 = *(int *)(uVar68 + lVar91 * 4);
                        iVar90 = iVar70 + iVar95;
                        iVar95 = iVar95 - iVar70;
                        iVar98 = *(int *)(uVar102 + lVar91 * 4);
                        iVar104 = *(int *)(uVar79 + lVar91 * 4);
                        iVar70 = iVar104 + iVar98;
                        iVar98 = iVar98 - iVar104;
                        *(int *)((long)&opt_q.workspace_allocator + lVar57 * 4 + 4) =
                             iVar90 + *(int *)((long)asVar85 + lVar91 * 4) + iVar70;
                        *(int *)(&opt_q.use_subgroup_shuffle + lVar57 * 4) = iVar95 + iVar98 * 2;
                        aiStack_380[lVar57 + -1] = iVar90 + iVar70 * 4;
                        *(int *)(auStack_368 + lVar57 * 4 + -4) =
                             iVar95 + iVar98 * 8 + *(int *)(uVar65 + lVar91 * 4) * 4;
                        asVar85 = (short  [4])((long)asVar85 + lVar75);
                        asVar117 = (short  [4])((long)asVar117 + lVar75);
                        uVar68 = uVar68 + lVar75;
                        uVar102 = uVar102 + lVar75;
                        uVar79 = uVar79 + lVar75;
                        uVar65 = uVar65 + lVar75;
                      }
                      iVar90 = *(int *)(uVar102 + lVar91 * 4);
                      iVar70 = *(int *)(uVar79 + lVar91 * 4);
                      iVar104 = iVar90 - iVar70;
                      iVar95 = *(int *)((long)asVar117 + lVar91 * 4);
                      iVar98 = *(int *)(uVar68 + lVar91 * 4);
                      iVar108 = iVar95 - iVar98;
                      opt_q.workspace_allocator._4_4_ =
                           (iVar98 + iVar95 + iVar70 + iVar90 + *(int *)((long)asVar85 + lVar91 * 4)
                           ) * 4;
                      opt_q._44_4_ = iVar104 * 8 + iVar108 * 4;
                      local_378._12_4_ =
                           *(int *)(uVar65 + lVar91 * 4) * 0x10 + iVar104 * 0x20 + iVar108 * 4;
                      piVar73 = piVar86;
                      for (lVar57 = 0x14; lVar57 != 0x74; lVar57 = lVar57 + 0x18) {
                        iVar95 = *(int *)((long)w1 + lVar57 + 4);
                        iVar90 = iVar95 + *(int *)((long)w1 + lVar57);
                        iVar95 = *(int *)((long)w1 + lVar57) - iVar95;
                        iVar98 = *(int *)((long)aiStack_3d0 + lVar57 + 4);
                        iVar70 = iVar98 + *(int *)((long)aiStack_3d0 + lVar57);
                        iVar98 = *(int *)((long)aiStack_3d0 + lVar57) - iVar98;
                        piVar73[-3] = (*(int *)((long)w1 + lVar57 + -4) + iVar90 + iVar70) / 0x240;
                        piVar73[-2] = (iVar95 + iVar98 * 2) / 0x240;
                        piVar73[-1] = (iVar90 + iVar70 * 4) / 0x240;
                        *piVar73 = (iVar95 + iVar98 * 8 + *(int *)(&opt_q.lightmode + lVar57)) /
                                   0x240;
                        piVar73 = piVar73 + iVar69;
                      }
                      asVar51 = (short  [4])((long)asVar51 + 4);
                      asVar77 = (short  [4])((long)asVar77 + 4);
                      uVar114 = uVar114 + 4;
                      uVar103 = uVar103 + 4;
                      uVar80 = uVar80 + 4;
                      uVar109 = uVar109 + 4;
                      piVar86 = piVar86 + 4;
                    }
                    local_6f8 = (int *)((long)local_6f8 +
                                       (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4
                                       );
                    local_640 = asVar78;
                    asVar64 = (short  [4])((long)asVar78 + 1);
                  }
                  local_620 = (int *)((long)local_620 + (long)local_510);
                }
                copy_cut_border((Mat *)&opt_b,&local_5f8,0,opt_b.flush_denormals - local_5f8.h,0,
                                opt_b._44_4_ - local_5f8.w,opt);
                piVar86 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
                if (piVar86 != (int *)0x0) {
                  LOCK();
                  *piVar86 = *piVar86 + -1;
                  UNLOCK();
                  if (*piVar86 == 0) {
                    if (opt_b._32_8_ == 0) {
                      free((void *)opt_b._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                    }
                  }
                }
                piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
                if (piVar86 != (int *)0x0) {
                  LOCK();
                  *piVar86 = *piVar86 + -1;
                  UNLOCK();
                  if (*piVar86 == 0) {
                    pvVar72 = local_558.data;
                    if (local_558.allocator == (Allocator *)0x0) goto LAB_00247aa9;
                    (*(local_558.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                conv3x3s1_winograd43_pack8to1_int8_sse_xop
                          (&local_698,&local_5f8,&this->weight_winograd43_data,opt);
              }
            }
            else {
              conv3x3s1_winograd43_pack8to1_int8_sse_avx2
                        (&local_698,&local_5f8,&this->weight_winograd43_data,opt);
            }
          }
          else {
            uVar94 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar70 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar69 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            iVar108 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
            iVar112 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
            lVar75 = (long)local_5f8.w;
            uVar105 = uVar94 * uVar81;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar105,local_698.c,8,8,
                          opt->workspace_allocator);
              uVar71 = 0;
              uVar105 = iVar98;
              if (iVar98 < 1) {
                uVar105 = 0;
              }
              if ((int)uVar82 < 1) {
                uVar82 = 0;
              }
              if ((int)uVar81 < 1) {
                uVar48 = uVar71;
              }
              uVar109 = (ulong)uVar94;
              if ((int)uVar94 < 1) {
                uVar109 = uVar71;
              }
              uVar114 = (ulong)(uint)iVar95;
              if (iVar95 < 1) {
                uVar114 = uVar71;
              }
              for (; uVar71 != uVar114; uVar71 = uVar71 + 1) {
                puVar84 = (undefined8 *)opt_q._0_8_;
                for (uVar80 = 0; uVar80 != uVar109; uVar80 = uVar80 + 1) {
                  for (uVar103 = 0; uVar103 != uVar48; uVar103 = uVar103 + 1) {
                    puVar83 = (undefined8 *)
                              ((long)local_698.data +
                              uVar103 * (long)iVar70 * 8 +
                              local_698.elemsize * (long)local_698.w * (long)iVar69 * uVar80 +
                              local_698.cstep * uVar71 * local_698.elemsize);
                    for (uVar81 = 0; uVar94 = uVar105, uVar81 != uVar82; uVar81 = uVar81 + 1) {
                      while (uVar94 != 0) {
                        *puVar84 = *puVar83;
                        puVar84 = puVar84 + 1;
                        puVar83 = puVar83 + iVar108;
                        uVar94 = uVar94 - 1;
                      }
                      puVar83 = puVar83 + ((long)(iVar90 * iVar112) - (long)(iVar108 * iVar98));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar86 != (int *)0x0) {
                LOCK();
                *piVar86 = *piVar86 + -1;
                UNLOCK();
                if (*piVar86 == 0) {
                  pvVar72 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) {
LAB_00247aa9:
                    free(pvVar72);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
            }
            else {
              uVar71 = (ulong)(uint)local_5f8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar105,
                         (allocator_type *)&local_558);
              local_718._0_4_ = iVar90 * iVar69 - iVar70 * uVar81;
              uVar53 = 0;
              if ((int)uVar81 < 1) {
                uVar48 = 0;
              }
              if ((int)uVar94 < 1) {
                uVar94 = uVar53;
              }
              iVar69 = 0;
              uVar109 = uVar48;
              iVar90 = 0;
              for (; uVar53 != uVar94; uVar53 = uVar53 + 1) {
                for (lVar91 = (long)iVar90; (int)uVar109 != lVar91; lVar91 = lVar91 + 1) {
                  *(int *)(opt_q._0_8_ + lVar91 * 4) = iVar69;
                  iVar69 = iVar69 + iVar70;
                }
                iVar69 = iVar69 + local_718._0_4_;
                uVar109 = (ulong)(uint)((int)uVar109 + (int)uVar48);
                iVar90 = iVar90 + (int)uVar48;
              }
              if ((int)uVar105 < 1) {
                uVar105 = 0;
              }
              uVar48 = (ulong)(uint)iVar95;
              if (iVar95 < 1) {
                uVar48 = 0;
              }
              uVar109 = 0;
              if (0 < iVar98) {
                uVar109 = (ulong)(uint)iVar98;
              }
              if ((int)uVar82 < 1) {
                uVar82 = 0;
              }
              if (iVar104 < 1) {
                uVar71 = 0;
              }
              for (uVar114 = 0; uVar114 != uVar71; uVar114 = uVar114 + 1) {
                local_718._0_8_ =
                     (Mat *)(local_5f8.elemsize * local_5f8.cstep * uVar114 + (long)local_5f8.data);
                for (uVar80 = 0; uVar80 != uVar82; uVar80 = uVar80 + 1) {
                  sVar5 = (this->weight_data_tm).cstep;
                  sVar6 = (this->weight_data_tm).elemsize;
                  pvVar72 = (this->weight_data_tm).data;
                  for (uVar103 = 0; uVar103 != uVar109; uVar103 = uVar103 + 1) {
                    iVar90 = 0;
                    pvVar62 = (void *)(sVar5 * uVar114 * sVar6 + (long)pvVar72);
                    for (uVar58 = 0; uVar58 != uVar48; uVar58 = uVar58 + 1) {
                      for (uVar65 = 0; uVar105 != uVar65; uVar65 = uVar65 + 1) {
                        auVar126._8_8_ = 0;
                        auVar126._0_8_ =
                             *(ulong *)((long)local_698.data +
                                       (long)*(int *)(opt_q._0_8_ + uVar65 * 4) * 8 +
                                       local_698.cstep * local_698.elemsize * uVar58 +
                                       (long)(iVar108 * 8 * (int)uVar103) +
                                       (long)local_698.w * uVar80 * (long)iVar112 *
                                       local_698.elemsize);
                        auVar120 = vpcmpgtb_avx((undefined1  [16])0x0,auVar126);
                        auVar137 = vpunpcklbw_avx(auVar126,auVar120);
                        auVar133._8_8_ = 0;
                        auVar133._0_8_ = *(ulong *)((long)pvVar62 + uVar65 * 8);
                        auVar120 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                        auVar120 = vpunpcklbw_avx(auVar133,auVar120);
                        auVar129 = vpmullw_avx(auVar120,auVar137);
                        auVar120 = vpmulhw_avx(auVar137,auVar120);
                        auVar137 = vpunpcklwd_avx(auVar129,auVar120);
                        auVar120 = vpunpckhwd_avx(auVar129,auVar120);
                        auVar120 = vpaddd_avx(auVar137,auVar120);
                        auVar120 = vphaddd_avx(auVar120,auVar120);
                        auVar120 = vphaddd_avx(auVar120,auVar120);
                        iVar90 = iVar90 + auVar120._0_4_;
                      }
                      pvVar62 = (void *)((long)pvVar62 + (ulong)uVar105 * 8);
                    }
                    *(int *)(local_718._0_8_ + uVar103 * 4) = iVar90;
                  }
                  local_718._0_8_ = local_718._0_8_ + lVar75 * 4;
                }
              }
LAB_002440a2:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar70 == 1 && local_630._0_4_ == 1) {
        p_Var3 = this->_vptr_Convolution_x86_avx[-3];
        uVar81 = *(uint *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        uVar48 = (ulong)uVar81;
        if ((uVar81 == 1) &&
           (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_698,&local_5f8,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 2))
            goto LAB_002435a2;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_5f8.w,local_5f8.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar48 = 0;
            if ((int)uVar82 < 1) {
              uVar82 = 0;
            }
            uVar71 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar71 = uVar48;
            }
            for (; uVar48 != uVar71; uVar48 = uVar48 + 1) {
              puVar60 = (undefined1 *)
                        (local_698.cstep * uVar48 * local_698.elemsize + (long)local_698.data);
              lVar75 = opt_q._0_8_;
              for (uVar81 = 0; uVar81 != uVar82; uVar81 = uVar81 + 1) {
                puVar87 = puVar60 + (iVar90 - iVar98) * 2;
                puVar96 = puVar60;
                for (lVar91 = 0; (int)lVar91 + 3 < iVar98; lVar91 = lVar91 + 4) {
                  *(undefined1 *)(lVar75 + lVar91) = *puVar96;
                  *(undefined1 *)(lVar75 + 1 + lVar91) = puVar96[2];
                  *(undefined1 *)(lVar75 + 2 + lVar91) = puVar96[4];
                  *(undefined1 *)(lVar75 + 3 + lVar91) = puVar96[6];
                  puVar96 = puVar96 + 8;
                  puVar87 = puVar87 + 8;
                }
                for (; (int)lVar91 + 1 < iVar98; lVar91 = lVar91 + 2) {
                  *(undefined1 *)(lVar75 + lVar91) = *puVar96;
                  *(undefined1 *)(lVar75 + 1 + lVar91) = puVar96[2];
                  puVar96 = puVar96 + 4;
                  puVar87 = puVar87 + 4;
                }
                for (; (int)lVar91 < iVar98; lVar91 = lVar91 + 1) {
                  *(undefined1 *)(lVar75 + lVar91) = puVar60[lVar91 * 2];
                  puVar87 = puVar87 + 2;
                }
                lVar75 = lVar75 + lVar91;
                puVar60 = puVar87;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
            piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar86 != (int *)0x0) {
              LOCK();
              *piVar86 = *piVar86 + -1;
              UNLOCK();
              if (*piVar86 == 0) {
                pvVar72 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_00247aa9;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_002435a2:
          if (((((opt->use_winograd_convolution != true) || (uVar81 != 3)) ||
               ((opt->use_winograd23_convolution == false ||
                (((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3 ||
                  (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))))) ||
              ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)))) ||
             ((iVar70 * local_600._0_4_ < 0x10 ||
              (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10)))) {
            uVar94 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar70 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar69 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            iVar108 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
            lVar75 = (long)iVar108;
            iVar112 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
            lVar91 = (long)local_5f8.w;
            uVar71 = (ulong)(uint)local_5f8.h;
            uVar105 = uVar94 * uVar81;
            uVar109 = (ulong)uVar105;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar105,local_698.c,1,1,
                          opt->workspace_allocator);
              lVar91 = (long)(iVar108 * 2);
              uVar71 = 0;
              if ((int)uVar82 < 1) {
                uVar82 = 0;
              }
              if ((int)uVar81 < 1) {
                uVar48 = uVar71;
              }
              uVar109 = (ulong)uVar94;
              if ((int)uVar94 < 1) {
                uVar109 = uVar71;
              }
              uVar114 = (ulong)(uint)iVar95;
              if (iVar95 < 1) {
                uVar114 = uVar71;
              }
              for (; uVar71 != uVar114; uVar71 = uVar71 + 1) {
                lVar57 = opt_q._0_8_;
                for (uVar80 = 0; uVar80 != uVar109; uVar80 = uVar80 + 1) {
                  for (uVar103 = 0; uVar103 != uVar48; uVar103 = uVar103 + 1) {
                    puVar60 = (undefined1 *)
                              ((long)local_698.data +
                              uVar103 * (long)iVar70 +
                              (long)local_698.w * local_698.elemsize * (long)iVar69 * uVar80 +
                              local_698.cstep * uVar71 * local_698.elemsize);
                    for (uVar81 = 0; uVar81 != uVar82; uVar81 = uVar81 + 1) {
                      lVar93 = 0;
                      puVar87 = puVar60;
                      for (lVar101 = 0; (int)lVar101 + 3 < iVar98; lVar101 = lVar101 + 4) {
                        *(undefined1 *)(lVar57 + lVar101) = *puVar87;
                        *(undefined1 *)(lVar57 + 1 + lVar101) = puVar87[lVar75];
                        *(undefined1 *)(lVar57 + 2 + lVar101) = puVar87[lVar91];
                        *(undefined1 *)(lVar57 + 3 + lVar101) = puVar87[iVar108 * 3];
                        puVar87 = puVar87 + iVar108 * 4;
                        lVar93 = lVar93 + iVar108 * 4;
                      }
                      for (; (int)lVar101 + 1 < iVar98; lVar101 = lVar101 + 2) {
                        *(undefined1 *)(lVar57 + lVar101) = *puVar87;
                        *(undefined1 *)(lVar57 + 1 + lVar101) = puVar87[lVar75];
                        puVar87 = puVar87 + lVar91;
                        lVar93 = lVar93 + lVar91;
                      }
                      for (; (int)lVar101 < iVar98; lVar101 = lVar101 + 1) {
                        *(undefined1 *)(lVar57 + lVar101) = puVar60[lVar93];
                        lVar93 = lVar93 + lVar75;
                      }
                      puVar60 = puVar60 + lVar93 + (iVar90 * iVar112 - iVar98 * iVar108);
                      lVar57 = lVar57 + lVar101;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
              piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar86 != (int *)0x0) {
                LOCK();
                *piVar86 = *piVar86 + -1;
                UNLOCK();
                if (*piVar86 == 0) {
                  pvVar72 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_00247aa9;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_002440af;
            }
            uVar114 = (ulong)(uint)local_5f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar105,
                       (allocator_type *)&local_558);
            iVar108 = 0;
            if ((int)uVar81 < 1) {
              uVar48 = 0;
            }
            if ((int)uVar94 < 1) {
              uVar94 = 0;
            }
            uVar80 = uVar48;
            iVar74 = 0;
            for (uVar53 = 0; uVar53 != uVar94; uVar53 = uVar53 + 1) {
              for (lVar57 = (long)iVar74; (int)uVar80 != lVar57; lVar57 = lVar57 + 1) {
                *(int *)(opt_q._0_8_ + lVar57 * 4) = iVar108;
                iVar108 = iVar108 + iVar70;
              }
              iVar108 = iVar108 + (iVar90 * iVar69 - iVar70 * uVar81);
              uVar80 = (ulong)(uint)((int)uVar80 + (int)uVar48);
              iVar74 = iVar74 + (int)uVar48;
            }
            local_600 = (short  [4])(local_5f8.elemsize * local_5f8.cstep);
            local_630._0_4_ = iVar95 * uVar105;
            if ((int)uVar105 < 1) {
              uVar109 = 0;
            }
            uVar48 = (ulong)(uint)iVar95;
            if (iVar95 < 1) {
              uVar48 = 0;
            }
            uVar80 = 0;
            if (0 < iVar98) {
              uVar80 = (ulong)(uint)iVar98;
            }
            if ((int)uVar82 < 1) {
              uVar71 = 0;
            }
            local_640 = (short  [4])local_5f8.data;
            if (iVar104 < 1) {
              uVar114 = 0;
            }
            for (uVar103 = 0; uVar103 != uVar114; uVar103 = uVar103 + 1) {
              local_718._0_8_ = (long)local_600 * uVar103 + (long)local_5f8.data;
              for (uVar58 = 0; uVar58 != uVar71; uVar58 = uVar58 + 1) {
                pvVar72 = (this->weight_data_tm).data;
                for (uVar65 = 0; uVar65 != uVar80; uVar65 = uVar65 + 1) {
                  iVar90 = 0;
                  lVar57 = (long)pvVar72 + (long)(int)(iVar95 * uVar105 * (int)uVar103);
                  for (uVar68 = 0; uVar68 != uVar48; uVar68 = uVar68 + 1) {
                    for (uVar79 = 0; uVar109 != uVar79; uVar79 = uVar79 + 1) {
                      iVar90 = iVar90 + (int)*(char *)(lVar57 + uVar79) *
                                        (int)*(char *)((long)local_698.data +
                                                      (long)*(int *)(opt_q._0_8_ + uVar79 * 4) +
                                                      local_698.cstep * local_698.elemsize * uVar68
                                                      + uVar65 * lVar75 +
                                                        (long)local_698.w * uVar58 * (long)iVar112 *
                                                        local_698.elemsize);
                    }
                    lVar57 = lVar57 + (int)uVar105;
                  }
                  *(int *)((long)(void **)local_718._0_8_ + uVar65 * 4) = iVar90;
                }
                local_718._0_8_ = (long)(void **)local_718._0_8_ + lVar91 * 4;
              }
            }
            goto LAB_002440a2;
          }
          lVar75 = (long)local_698.c;
          uVar48 = (ulong)local_5f8.c;
          piVar86 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
          opt_q._0_8_ = local_698.data;
          opt_q.blob_allocator._0_4_ = local_698.refcount._0_4_;
          opt_q.blob_allocator._4_4_ = local_698.refcount._4_4_;
          opt_q.workspace_allocator._0_4_ = (undefined4)local_698.elemsize;
          opt_q.workspace_allocator._4_4_ = (int)(local_698.elemsize >> 0x20);
          opt_q.openmp_blocktime = local_698.elempack;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_698.w;
          opt_q.use_image_storage = (bool)local_698.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_698.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_698.w._3_1_;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_698.dims;
          opt_q.use_subgroup_basic = (bool)local_698.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_698.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_698.dims._3_1_;
          opt_q.use_local_pool_allocator = (bool)(undefined1)local_698.d;
          opt_q.use_shader_local_memory = (bool)local_698.d._1_1_;
          opt_q.use_cooperative_matrix = (bool)local_698.d._2_1_;
          opt_q.use_winograd23_convolution = (bool)local_698.d._3_1_;
          opt_q.flush_denormals = local_698.h;
          opt_q._32_8_ = local_698.allocator;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_698.c;
          opt_q.use_winograd63_convolution = (bool)local_698.c._1_1_;
          opt_q.use_reserved_6 = (bool)local_698.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_698.c._3_1_;
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + 1;
            UNLOCK();
          }
          uVar71 = (long)(int)(local_5f8.w + 1) / 2;
          local_400 = uVar71 & 0xffffffff;
          uVar109 = (long)(int)(local_5f8.h + 1) / 2;
          iVar90 = (int)uVar109;
          local_3e0 = iVar90 * 2;
          iVar70 = (int)uVar71 * 2 + 2;
          opt_b.lightmode = opt->lightmode;
          opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_b.num_threads = opt->num_threads;
          opt_b.workspace_allocator = opt->workspace_allocator;
          uVar17 = opt->openmp_blocktime;
          uVar18 = opt->use_winograd_convolution;
          uVar20 = opt->use_sgemm_convolution;
          uVar22 = opt->use_int8_inference;
          uVar24 = opt->use_vulkan_compute;
          uVar23 = CONCAT11(uVar24,uVar22);
          uVar21 = CONCAT21(uVar23,uVar20);
          uVar19 = CONCAT31(uVar21,uVar18);
          opt_b.use_bf16_storage = opt->use_bf16_storage;
          opt_b.use_fp16_packed = opt->use_fp16_packed;
          opt_b.use_fp16_storage = opt->use_fp16_storage;
          opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_b.use_int8_packed = opt->use_int8_packed;
          opt_b.use_int8_storage = opt->use_int8_storage;
          opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_b.use_packing_layout = opt->use_packing_layout;
          uVar45._0_1_ = opt->use_shader_pack8;
          uVar45._1_1_ = opt->use_subgroup_basic;
          uVar45._2_1_ = opt->use_subgroup_vote;
          uVar45._3_1_ = opt->use_subgroup_ballot;
          uVar25 = opt->use_subgroup_shuffle;
          uVar26 = opt->use_image_storage;
          uVar28 = opt->use_tensor_storage;
          uVar30 = opt->use_reserved_0;
          uVar29 = CONCAT11(uVar30,uVar28);
          uVar27 = CONCAT21(uVar29,uVar26);
          uVar45._4_4_ = CONCAT31(uVar27,uVar25);
          uVar31 = opt->flush_denormals;
          uVar32 = opt->use_local_pool_allocator;
          uVar34 = opt->use_shader_local_memory;
          uVar36 = opt->use_cooperative_matrix;
          uVar38 = opt->use_winograd23_convolution;
          uVar37 = CONCAT11(uVar38,uVar36);
          uVar35 = CONCAT21(uVar37,uVar34);
          uVar33 = CONCAT31(uVar35,uVar32);
          uVar46._0_1_ = opt->use_winograd43_convolution;
          uVar46._1_1_ = opt->use_winograd63_convolution;
          uVar46._2_1_ = opt->use_reserved_6;
          uVar46._3_1_ = opt->use_reserved_7;
          uVar39 = opt->use_reserved_8;
          uVar40 = opt->use_reserved_9;
          uVar42 = opt->use_reserved_10;
          uVar44 = opt->use_reserved_11;
          uVar43 = CONCAT11(uVar44,uVar42);
          uVar41 = CONCAT21(uVar43,uVar40);
          uVar46._4_4_ = CONCAT31(uVar41,uVar39);
          opt_b._40_4_ = SUB84(uVar45,0);
          opt_b._56_4_ = SUB84(uVar46,0);
          opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
          opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          opt_b.openmp_blocktime = uVar17;
          opt_b._28_4_ = uVar19;
          opt_b._44_4_ = uVar45._4_4_;
          opt_b.flush_denormals = uVar31;
          opt_b._52_4_ = uVar33;
          opt_b._60_4_ = uVar46._4_4_;
          copy_make_border(&local_698,(Mat *)&opt_q,0,(local_3e0 - local_698.h) + 2,0,
                           iVar70 - local_698.w,0,0.0,&opt_b);
          local_558.cstep = 0;
          asVar50._0_4_ = iVar90 * (int)local_400;
          asVar50[2] = 0;
          asVar50[3] = 0;
          local_558.data = (void *)0x0;
          local_558.refcount._0_4_ = 0;
          local_558.refcount._4_4_ = 0;
          local_558.elemsize = 0;
          local_558.elempack = 0;
          local_558.allocator = (Allocator *)0x0;
          local_558.dims = 0;
          local_558.w = 0;
          local_558.h = 0;
          local_558.d = 0;
          local_558.c = 0;
          Mat::create(&local_558,0x10,asVar50._0_4_,iVar95,2,opt->workspace_allocator);
          uVar45 = opt_q._0_8_;
          pvVar72 = local_558.data;
          uVar82 = (uint)local_400;
          local_3e4 = uVar82 * 2;
          lVar91 = CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          lVar57 = local_558.elemsize * local_558.cstep;
          lVar101 = (long)iVar70;
          uVar71 = 0;
          uVar81 = 0;
          if (0 < (int)uVar82) {
            uVar81 = uVar82;
          }
          uVar109 = uVar109 & 0xffffffff;
          if (iVar90 < 1) {
            uVar109 = uVar71;
          }
          uVar114 = 0;
          if (0 < iVar95) {
            uVar114 = (ulong)(uint)iVar95;
          }
          for (; uVar71 != uVar114; uVar71 = uVar71 + 1) {
            pvVar62 = (void *)(lVar57 * uVar71 + (long)pvVar72);
            for (uVar80 = 0; uVar80 != uVar109; uVar80 = uVar80 + 1) {
              lVar99 = (long)(iVar70 * 2 * (int)uVar80) + lVar91 * sVar5 * uVar71 + uVar45;
              lVar93 = lVar99 + lVar101;
              lVar113 = lVar101 + lVar93;
              lVar59 = lVar113 + lVar101;
              for (uVar82 = 0; uVar82 != uVar81; uVar82 = uVar82 + 1) {
                for (lVar67 = 0; lVar67 != 4; lVar67 = lVar67 + 1) {
                  d0[lVar67] = (short)*(char *)(lVar99 + lVar67);
                  d1[lVar67] = (short)*(char *)(lVar93 + lVar67);
                  d2[lVar67] = (short)*(char *)(lVar113 + lVar67);
                  d3[lVar67] = (short)*(char *)(lVar59 + lVar67);
                }
                for (lVar67 = 0; lVar67 != 8; lVar67 = lVar67 + 2) {
                  sVar1 = *(short *)((long)d2 + lVar67);
                  *(short *)((long)w0 + lVar67) = *(short *)((long)d0 + lVar67) - sVar1;
                  sVar2 = *(short *)((long)d1 + lVar67);
                  *(short *)((long)w1 + lVar67) = sVar2 + sVar1;
                  *(short *)((long)w2 + lVar67) = sVar1 - sVar2;
                  *(short *)((long)w3 + lVar67) = *(short *)((long)d3 + lVar67) - sVar2;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar67 = 0; lVar67 != 8; lVar67 = lVar67 + 2) {
                  sVar1 = *(short *)((long)t2 + lVar67);
                  *(short *)((long)d0 + lVar67) = *(short *)((long)t0 + lVar67) - sVar1;
                  sVar2 = *(short *)((long)t1 + lVar67);
                  *(short *)((long)d1 + lVar67) = sVar2 + sVar1;
                  *(short *)((long)d2 + lVar67) = sVar1 - sVar2;
                  *(short *)((long)d3 + lVar67) = *(short *)((long)t3 + lVar67) - sVar2;
                }
                for (lVar67 = 0; lVar67 != 8; lVar67 = lVar67 + 2) {
                  *(undefined2 *)((long)pvVar62 + lVar67) = *(undefined2 *)((long)d0 + lVar67);
                  *(undefined2 *)((long)pvVar62 + lVar67 + 8) = *(undefined2 *)((long)d1 + lVar67);
                  *(undefined2 *)((long)pvVar62 + lVar67 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar67);
                  *(undefined2 *)((long)pvVar62 + lVar67 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar67);
                }
                lVar99 = lVar99 + 2;
                lVar93 = lVar93 + 2;
                lVar113 = lVar113 + 2;
                lVar59 = lVar59 + 2;
                pvVar62 = (void *)((long)pvVar62 + 0x20);
              }
            }
          }
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
          opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          Mat::create((Mat *)d0,0x10,asVar50._0_4_,iVar104,4,opt->workspace_allocator);
          asVar56._0_4_ = iVar104 >> 2;
          local_168 = 0;
          local_170 = (this->weight_winograd23_data).elemsize;
          lVar91 = (this->weight_winograd23_data).cstep * local_170;
          asVar88[0] = 0;
          asVar88[1] = 0;
          asVar88[2] = 0;
          asVar88[3] = 0;
          if ((int)asVar50._0_4_ < 1) {
            asVar50 = asVar88;
          }
          local_648 = (short  [4])(this->weight_winograd23_data).data;
          asVar56[2] = 0;
          asVar56[3] = 0;
          if ((int)asVar56._0_4_ < 1) {
            asVar56 = asVar88;
          }
          local_160[0] = asVar56[0];
          local_160[1] = asVar56[1];
          local_160[2] = asVar56[2];
          local_160[3] = asVar56[3];
          local_178 = lVar91 * 4;
          local_180 = local_170 * 4;
          local_628 = (void *)(lVar91 * 3 + (long)local_648);
          local_610 = (void *)((long)local_648 + lVar91 * 2);
          local_188 = 0;
          local_408[0] = d0[0];
          local_408[1] = d0[1];
          local_408[2] = d0[2];
          local_408[3] = d0[3];
          local_510[0] = d0[0];
          local_510[1] = d0[1];
          local_510[2] = d0[2];
          local_510[3] = d0[3];
          local_638 = (void *)((long)local_648 + lVar91);
          for (; asVar88 != asVar56; asVar88 = (short  [4])((long)asVar88 + 1)) {
            lVar57 = (long)(this->weight_winograd23_data).w;
            lVar101 = local_170 * lVar57;
            lVar57 = lVar57 * local_170 * 4;
            local_3f8[0] = d0[0];
            local_3f8[1] = d0[1];
            local_3f8[2] = d0[2];
            local_3f8[3] = d0[3];
            asVar66[0] = 0;
            asVar66[1] = 0;
            asVar66[2] = 0;
            asVar66[3] = 0;
            while (asVar78 = asVar66, asVar78 != asVar50) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              d2[0] = 0;
              d2[1] = 0;
              d2[2] = 0;
              d2[3] = 0;
              d3[0] = 0;
              d3[1] = 0;
              d3[2] = 0;
              d3[3] = 0;
              w0[0] = 0;
              w0[1] = 0;
              w0[2] = 0;
              w0[3] = 0;
              local_608 = (short  [4])(local_558.elemsize * local_558.cstep);
              lVar113 = (long)local_558.w * (long)asVar78;
              pvVar97 = (void *)((local_558.cstep * 3 + lVar113) * local_558.elemsize +
                                (long)local_558.data);
              lVar93 = (long)local_608 * 4;
              pvVar100 = (void *)((lVar113 + local_558.cstep * 2) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar115 = (void *)((local_558.cstep + lVar113) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar92 = (void *)(lVar113 * local_558.elemsize + (long)local_558.data);
              local_6d8 = local_610;
              pvVar72 = local_638;
              pvVar62 = local_628;
              asVar51 = local_648;
              for (uVar71 = 0; (long)(uVar71 | 3) < lVar75; uVar71 = uVar71 + 4) {
                for (lVar113 = 0; lVar113 != 0x20; lVar113 = lVar113 + 2) {
                  iVar98 = (int)*(short *)((long)pvVar92 + lVar113);
                  iVar90 = (int)*(short *)((long)pvVar115 + lVar113);
                  iVar70 = (int)*(short *)((long)pvVar100 + lVar113);
                  iVar95 = (int)*(short *)((long)pvVar97 + lVar113);
                  *(int *)(d1 + lVar113) =
                       *(short *)((long)asVar51 + lVar113 + 0x60) * iVar95 +
                       *(short *)((long)asVar51 + lVar113 + 0x40) * iVar70 +
                       *(short *)((long)asVar51 + lVar113 + 0x20) * iVar90 +
                       *(short *)((long)asVar51 + lVar113) * iVar98 + *(int *)(d1 + lVar113);
                  lVar59 = lVar91 + lVar113;
                  *(int *)(d2 + lVar113) =
                       *(short *)((long)asVar51 + lVar91 + 0x60 + lVar113) * iVar95 +
                       *(short *)((long)asVar51 + lVar91 + 0x40 + lVar113) * iVar70 +
                       *(short *)((long)asVar51 + lVar91 + 0x20 + lVar113) * iVar90 +
                       *(short *)((long)asVar51 + lVar91 + lVar113) * iVar98 +
                       *(int *)(d2 + lVar113);
                  lVar99 = lVar91 + lVar59;
                  *(int *)(d3 + lVar113) =
                       *(short *)((long)asVar51 + lVar91 + 0x60 + lVar59) * iVar95 +
                       *(short *)((long)asVar51 + lVar91 + 0x40 + lVar59) * iVar70 +
                       *(short *)((long)asVar51 + lVar91 + 0x20 + lVar59) * iVar90 +
                       *(short *)((long)asVar51 + lVar91 + lVar59) * iVar98 + *(int *)(d3 + lVar113)
                  ;
                  *(int *)(w0 + lVar113) =
                       *(short *)((long)asVar51 + lVar91 + 0x60 + lVar99) * iVar95 +
                       *(short *)((long)asVar51 + lVar91 + 0x40 + lVar99) * iVar70 +
                       *(short *)((long)asVar51 + lVar91 + 0x20 + lVar99) * iVar90 +
                       *(short *)((long)asVar51 + lVar91 + lVar99) * iVar98 + *(int *)(w0 + lVar113)
                  ;
                }
                pvVar97 = (void *)((long)pvVar97 + lVar93);
                pvVar100 = (void *)((long)pvVar100 + lVar93);
                pvVar115 = (void *)((long)pvVar115 + lVar93);
                asVar51 = (short  [4])((long)asVar51 + lVar57);
                pvVar92 = (void *)((long)pvVar92 + lVar93);
                pvVar62 = (void *)((long)pvVar62 + lVar57);
                local_6d8 = (void *)((long)local_6d8 + lVar57);
                pvVar72 = (void *)((long)pvVar72 + lVar57);
              }
              for (; (long)uVar71 < lVar75; uVar71 = uVar71 + 1) {
                for (lVar93 = 0; lVar93 != 0x20; lVar93 = lVar93 + 2) {
                  iVar90 = (int)*(short *)((long)pvVar92 + lVar93);
                  *(int *)(d1 + lVar93) =
                       *(int *)(d1 + lVar93) + *(short *)((long)asVar51 + lVar93) * iVar90;
                  *(int *)(d2 + lVar93) =
                       *(int *)(d2 + lVar93) + *(short *)((long)pvVar72 + lVar93) * iVar90;
                  *(int *)(d3 + lVar93) =
                       *(int *)(d3 + lVar93) + *(short *)((long)local_6d8 + lVar93) * iVar90;
                  *(int *)(w0 + lVar93) =
                       *(int *)(w0 + lVar93) + *(short *)((long)pvVar62 + lVar93) * iVar90;
                }
                pvVar62 = (void *)((long)pvVar62 + lVar101);
                local_6d8 = (void *)((long)local_6d8 + lVar101);
                pvVar72 = (void *)((long)pvVar72 + lVar101);
                asVar51 = (short  [4])((long)asVar51 + lVar101);
                pvVar92 = (void *)((long)pvVar92 + (long)local_608);
              }
              for (lVar93 = 0; lVar93 != 0x40; lVar93 = lVar93 + 4) {
                *(undefined4 *)((long)d0 + lVar93) = *(undefined4 *)((long)d1 + lVar93);
                *(undefined4 *)((long)local_510 + lVar93) = *(undefined4 *)((long)d2 + lVar93);
                *(undefined4 *)((long)local_408 + lVar93) = *(undefined4 *)((long)d3 + lVar93);
                *(undefined4 *)((long)d0 + lVar93) = *(undefined4 *)((long)w0 + lVar93);
              }
              local_640 = asVar78;
              local_630 = d0;
              local_600 = local_408;
              asVar66 = (short  [4])((long)asVar78 + 1);
            }
            local_648 = (short  [4])((long)local_648 + local_178);
            local_628 = (void *)((long)local_628 + local_178);
            local_610 = (void *)((long)local_610 + local_178);
            local_638 = (void *)((long)local_638 + local_178);
          }
          uVar71 = uVar48 & 0xfffffffffffffffc;
          local_610 = (void *)(this->weight_winograd23_data).elemsize;
          local_638 = (void *)((this->weight_winograd23_data).cstep * (long)local_610);
          local_740 = (void *)((long)local_638 * uVar71 + (long)(this->weight_winograd23_data).data)
          ;
          local_618 = (long)local_610 * 3;
          local_628 = (void *)0x0;
          local_620 = (int *)0x0;
          for (; local_648[0] = d0[0], local_648[1] = d0[1], local_648[2] = d0[2],
              local_648[3] = d0[3], (long)uVar71 < (long)uVar48; uVar71 = uVar71 + 1) {
            lVar91 = (long)(this->weight_winograd23_data).w;
            local_630 = (short  [4])((long)local_610 * lVar91);
            local_640 = (short  [4])(local_618 * lVar91 + (long)local_740);
            lVar57 = (long)local_610 * 4 * lVar91;
            local_600 = (short  [4])(lVar91 * (long)local_610 * 2 + (long)local_740);
            local_608 = (short  [4])((long)local_740 + (long)local_630);
            asVar76[0] = 0;
            asVar76[1] = 0;
            asVar76[2] = 0;
            asVar76[3] = 0;
            for (; asVar76 != asVar50; asVar76 = (short  [4])((long)asVar76 + 1)) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              lVar101 = (long)local_558.w * (long)asVar76;
              pvVar97 = (void *)((local_558.cstep * 3 + lVar101) * local_558.elemsize +
                                (long)local_558.data);
              lVar91 = local_558.elemsize * local_558.cstep * 4;
              pvVar62 = (void *)((lVar101 + local_558.cstep * 2) * local_558.elemsize +
                                (long)local_558.data);
              pvVar100 = (void *)((local_558.cstep + lVar101) * local_558.elemsize +
                                 (long)local_558.data);
              pvVar92 = (void *)(lVar101 * local_558.elemsize + (long)local_558.data);
              pvVar72 = local_740;
              asVar78 = local_608;
              asVar51 = local_640;
              asVar77 = local_600;
              for (uVar114 = 0; (long)(uVar114 | 3) < lVar75; uVar114 = uVar114 + 4) {
                for (lVar101 = 0; lVar101 != 0x20; lVar101 = lVar101 + 2) {
                  *(int *)(d1 + lVar101) =
                       (int)*(short *)((long)asVar51 + lVar101) *
                       (int)*(short *)((long)pvVar97 + lVar101) +
                       (int)*(short *)((long)asVar77 + lVar101) *
                       (int)*(short *)((long)pvVar62 + lVar101) +
                       (int)*(short *)((long)asVar78 + lVar101) *
                       (int)*(short *)((long)pvVar100 + lVar101) +
                       (int)*(short *)((long)pvVar72 + lVar101) *
                       (int)*(short *)((long)pvVar92 + lVar101) + *(int *)(d1 + lVar101);
                }
                asVar51 = (short  [4])((long)asVar51 + lVar57);
                pvVar97 = (void *)((long)pvVar97 + lVar91);
                asVar77 = (short  [4])((long)asVar77 + lVar57);
                pvVar62 = (void *)((long)pvVar62 + lVar91);
                asVar78 = (short  [4])((long)asVar78 + lVar57);
                pvVar100 = (void *)((long)pvVar100 + lVar91);
                pvVar72 = (void *)((long)pvVar72 + lVar57);
                pvVar92 = (void *)((long)pvVar92 + lVar91);
              }
              for (; (long)uVar114 < lVar75; uVar114 = uVar114 + 1) {
                for (lVar91 = 0; lVar91 != 0x10; lVar91 = lVar91 + 1) {
                  *(int *)(d1 + lVar91 * 2) =
                       *(int *)(d1 + lVar91 * 2) +
                       (int)*(short *)((long)pvVar72 + lVar91 * 2) *
                       (int)*(short *)((long)pvVar92 + lVar91 * 2);
                }
                pvVar72 = (void *)((long)pvVar72 + (long)local_630);
                pvVar92 = (void *)((long)pvVar92 + local_558.elemsize * local_558.cstep);
              }
              for (lVar91 = 0; lVar91 != 0x10; lVar91 = lVar91 + 1) {
                *(undefined4 *)((long)d0 + lVar91 * 4) = *(undefined4 *)(d1 + lVar91 * 2);
              }
            }
            local_740 = (void *)((long)local_740 + (long)local_638);
          }
          piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          asVar78 = d0;
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            asVar78 = local_648;
            if (*piVar86 == 0) {
              local_648 = d0;
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
                asVar78 = local_648;
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
                asVar78 = local_648;
              }
            }
          }
          local_648 = asVar78;
          local_558.cstep = 0;
          local_558.data = (void *)0x0;
          local_558.refcount._0_4_ = 0;
          local_558.refcount._4_4_ = 0;
          local_558.elemsize = 0;
          local_558.elempack = 0;
          local_558.h = 0;
          local_558.d = 0;
          local_558.c = 0;
          local_558.allocator = (Allocator *)0x0;
          local_558.dims = 0;
          local_558.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          Mat::create((Mat *)d1,local_3e4,local_3e0,iVar104,4,opt->workspace_allocator);
          uVar71 = 0;
          uVar48 = (ulong)(uint)iVar104;
          if (iVar104 < 1) {
            uVar48 = uVar71;
          }
          for (; uVar71 != uVar48; uVar71 = uVar71 + 1) {
            for (uVar114 = 0; uVar114 != uVar109; uVar114 = uVar114 + 1) {
              asVar78 = d1;
              asVar51 = d1;
              for (uVar80 = 0; uVar80 != uVar81; uVar80 = uVar80 + 1) {
                for (lVar75 = 0; lVar75 != 0x10; lVar75 = lVar75 + 4) {
                  *(undefined4 *)((long)d2 + lVar75) = *(undefined4 *)((long)d0 + lVar75);
                  *(undefined4 *)((long)d3 + lVar75) = *(undefined4 *)((long)d0 + 0x10 + lVar75);
                  *(undefined4 *)((long)w0 + lVar75) = *(undefined4 *)((long)d0 + 0x20 + lVar75);
                  *(undefined4 *)((long)w1 + lVar75) = *(undefined4 *)((long)d0 + 0x30 + lVar75);
                }
                for (lVar75 = 0; lVar75 != 0x10; lVar75 = lVar75 + 4) {
                  *(int *)((long)w2 + lVar75) =
                       *(int *)((long)d2 + lVar75) + *(int *)((long)d3 + lVar75) +
                       *(int *)((long)w0 + lVar75);
                  *(int *)((long)w3 + lVar75) =
                       (*(int *)((long)d3 + lVar75) - *(int *)((long)w0 + lVar75)) +
                       *(int *)((long)w1 + lVar75);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2._0_4_ = local_410;
                t2._4_4_ = local_420;
                t3._0_4_ = local_40c;
                t3._4_4_ = local_41c;
                for (lVar75 = 0; lVar75 != 8; lVar75 = lVar75 + 4) {
                  *(int *)((long)o0 + lVar75) =
                       *(int *)((long)t0 + lVar75) + *(int *)((long)t1 + lVar75) +
                       *(int *)((long)t2 + lVar75);
                  *(int *)((long)o0 + lVar75 + -8) =
                       (*(int *)((long)t1 + lVar75) - *(int *)((long)t2 + lVar75)) +
                       *(int *)((long)t3 + lVar75);
                }
                auVar122._8_8_ = 0;
                auVar122._0_4_ = o0[0];
                auVar122._4_4_ = o0[1];
                auVar120 = vpsrad_avx(auVar122,2);
                *(long *)asVar78 = auVar120._0_8_;
                auVar123._8_8_ = 0;
                auVar123._0_8_ = local_158;
                auVar120 = vpsrad_avx(auVar123,2);
                *(long *)asVar51 = auVar120._0_8_;
                asVar78 = (short  [4])((long)asVar78 + 8);
                asVar51 = (short  [4])((long)asVar51 + 8);
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_5f8,0,-local_5f8.h,0,-local_5f8.w,opt);
          piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              pvVar72 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_00247aa9;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
    else {
LAB_002417da:
      if (((opt->use_winograd_convolution != true) || (uVar105 != 3)) ||
         ((opt->use_winograd43_convolution == false ||
          ((((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3 ||
             (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
            (*(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data) != 1)))))))) {
        uVar53 = *(uint *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
        uVar71 = (ulong)uVar53;
        iVar90 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
        iVar104 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
        local_718._0_8_ = (long)iVar104;
        iVar69 = *(int *)(p_Var3 + 0x44 + (long)&(this->weight_winograd23_data).data);
        iVar108 = *(int *)(p_Var3 + (long)&(this->weight_winograd43_data).data);
        local_728._0_4_ = local_698.w;
        lVar75 = (long)local_5f8.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_5f8.h * local_5f8.w,uVar53 * uVar105,local_698.c,8,8,
                      opt->workspace_allocator);
          iVar98 = iVar69 * uVar81;
          if ((int)uVar81 < 1) {
            uVar81 = 0;
          }
          if ((int)uVar94 < 1) {
            uVar94 = 0;
          }
          if ((int)uVar105 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar53 < 1) {
            uVar71 = 0;
          }
          if ((int)uVar82 < 1) {
            uVar82 = 0;
          }
          for (uVar109 = 0; uVar109 != uVar82; uVar109 = uVar109 + 1) {
            pvVar72 = (void *)(local_698.cstep * uVar109 * local_698.elemsize + (long)local_698.data
                              );
            local_728._0_8_ = pvVar72;
            lVar75 = local_698.elemsize * (long)local_698.w * (long)iVar104;
            local_718._0_8_ = lVar75;
            puVar84 = (undefined8 *)opt_q._0_8_;
            for (uVar114 = 0; uVar114 != uVar71; uVar114 = uVar114 + 1) {
              for (uVar80 = 0; uVar80 != uVar48; uVar80 = uVar80 + 1) {
                puVar83 = (undefined8 *)
                          ((long)pvVar72 + uVar80 * (long)iVar90 * 8 + lVar75 * uVar114);
                for (uVar105 = 0; uVar53 = uVar81, uVar105 != uVar94; uVar105 = uVar105 + 1) {
                  while (uVar53 != 0) {
                    *puVar84 = *puVar83;
                    puVar84 = puVar84 + 1;
                    puVar83 = puVar83 + iVar69;
                    uVar53 = uVar53 - 1;
                  }
                  puVar83 = puVar83 + ((long)(iVar95 * iVar108) - (long)iVar98);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_5f8,&this->weight_sgemm_data,opt);
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_0024426d;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar111 = uVar53 * uVar105;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar111,
                     (allocator_type *)&local_558);
          local_728._0_4_ = iVar95 * iVar104 - iVar90 * uVar105;
          uVar52 = 0;
          if ((int)uVar105 < 1) {
            uVar48 = 0;
          }
          if ((int)uVar53 < 1) {
            uVar53 = 0;
          }
          iVar104 = 0;
          uVar71 = uVar48;
          iVar95 = 0;
          for (; uVar52 != uVar53; uVar52 = uVar52 + 1) {
            for (lVar91 = (long)iVar95; (int)uVar71 != lVar91; lVar91 = lVar91 + 1) {
              *(int *)(opt_q._0_8_ + lVar91 * 4) = iVar104;
              iVar104 = iVar104 + iVar90;
            }
            iVar104 = iVar104 + local_728._0_4_;
            uVar71 = (ulong)(uint)((int)uVar71 + (int)uVar48);
            iVar95 = iVar95 + (int)uVar48;
          }
          uVar71 = 0;
          uVar48 = (ulong)uVar111;
          if ((int)uVar111 < 1) {
            uVar48 = uVar71;
          }
          uVar109 = (ulong)uVar82;
          if ((int)uVar82 < 1) {
            uVar109 = uVar71;
          }
          local_718._0_8_ = 0;
          if (0 < (int)uVar81) {
            local_718._0_8_ = ZEXT48(uVar81);
          }
          uVar114 = (ulong)uVar94;
          if ((int)uVar94 < 1) {
            uVar114 = uVar71;
          }
          uVar80 = (ulong)(uint)iVar98;
          if (iVar98 < 1) {
            uVar80 = uVar71;
          }
          for (; uVar71 != uVar80; uVar71 = uVar71 + 1) {
            local_728._0_8_ =
                 (Mat *)(local_5f8.cstep * uVar71 * local_5f8.elemsize + (long)local_5f8.data);
            for (uVar103 = 0; uVar103 != uVar114; uVar103 = uVar103 + 1) {
              for (uVar58 = 0; uVar58 != local_718._0_8_; uVar58 = uVar58 + 1) {
                pvVar72 = (void *)((this->weight_data_tm).cstep * uVar71 *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
                auVar132 = ZEXT1664((undefined1  [16])0x0);
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                auVar134 = ZEXT1664((undefined1  [16])0x0);
                auVar136 = ZEXT1664((undefined1  [16])0x0);
                for (uVar65 = 0; uVar65 != uVar109; uVar65 = uVar65 + 1) {
                  for (lVar91 = 0; uVar48 * 4 != lVar91; lVar91 = lVar91 + 4) {
                    auVar129._8_8_ = 0;
                    auVar129._0_8_ =
                         *(ulong *)((long)local_698.data +
                                   (long)*(int *)(opt_q._0_8_ + lVar91) * 8 +
                                   local_698.cstep * local_698.elemsize * uVar65 +
                                   (long)(iVar69 * 8 * (int)uVar58) +
                                   (long)local_698.w * uVar103 * (long)iVar108 * local_698.elemsize)
                    ;
                    auVar120 = vpcmpgtb_avx((undefined1  [16])0x0,auVar129);
                    auVar139 = vpunpcklbw_avx(auVar129,auVar120);
                    auVar120 = *(undefined1 (*) [16])((long)pvVar72 + lVar91 * 8);
                    auVar129 = *(undefined1 (*) [16])((long)pvVar72 + lVar91 * 8 + 0x10);
                    auVar137 = vpcmpgtb_avx((undefined1  [16])0x0,auVar120);
                    auVar141 = vpcmpgtb_avx((undefined1  [16])0x0,auVar129);
                    auVar130 = vpunpcklbw_avx(auVar120,auVar137);
                    auVar120 = vpunpckhbw_avx(auVar120,auVar137);
                    auVar137 = vpunpcklbw_avx(auVar129,auVar141);
                    auVar129 = vpunpckhbw_avx(auVar129,auVar141);
                    auVar142 = vpmullw_avx(auVar130,auVar139);
                    auVar130 = vpmulhw_avx(auVar130,auVar139);
                    auVar140 = vpmullw_avx(auVar139,auVar120);
                    auVar131 = vpmulhw_avx(auVar139,auVar120);
                    auVar135 = vpmullw_avx(auVar137,auVar139);
                    auVar127 = vpmulhw_avx(auVar137,auVar139);
                    auVar122 = vpmullw_avx(auVar139,auVar129);
                    auVar139 = vpmulhw_avx(auVar139,auVar129);
                    auVar120 = vpunpcklwd_avx(auVar142,auVar130);
                    auVar120 = vpaddd_avx(auVar136._0_16_,auVar120);
                    auVar129 = vpunpcklwd_avx(auVar140,auVar131);
                    auVar129 = vpaddd_avx(auVar134._0_16_,auVar129);
                    auVar137 = vpunpcklwd_avx(auVar135,auVar127);
                    auVar137 = vpaddd_avx(auVar125._0_16_,auVar137);
                    auVar141 = vpunpcklwd_avx(auVar122,auVar139);
                    auVar141 = vpaddd_avx(auVar132._0_16_,auVar141);
                    auVar130 = vpunpckhwd_avx(auVar142,auVar130);
                    auVar120 = vpaddd_avx(auVar120,auVar130);
                    auVar136 = ZEXT1664(auVar120);
                    auVar120 = vpunpckhwd_avx(auVar140,auVar131);
                    auVar120 = vpaddd_avx(auVar129,auVar120);
                    auVar134 = ZEXT1664(auVar120);
                    auVar120 = vpunpckhwd_avx(auVar135,auVar127);
                    auVar120 = vpaddd_avx(auVar137,auVar120);
                    auVar125 = ZEXT1664(auVar120);
                    auVar120 = vpunpckhwd_avx(auVar122,auVar139);
                    auVar120 = vpaddd_avx(auVar141,auVar120);
                    auVar132 = ZEXT1664(auVar120);
                  }
                  pvVar72 = (void *)((long)pvVar72 + uVar48 * 0x20);
                }
                auVar120 = vpunpckldq_avx(auVar136._0_16_,auVar134._0_16_);
                auVar141 = vpunpckldq_avx(auVar125._0_16_,auVar132._0_16_);
                auVar129 = vpunpckhdq_avx(auVar136._0_16_,auVar134._0_16_);
                auVar137 = vpunpckhdq_avx(auVar125._0_16_,auVar132._0_16_);
                auVar130 = vpunpcklqdq_avx(auVar120,auVar141);
                auVar120 = vpunpckhqdq_avx(auVar120,auVar141);
                auVar120 = vpaddd_avx(auVar130,auVar120);
                auVar141 = vpunpcklqdq_avx(auVar129,auVar137);
                auVar129 = vpunpckhqdq_avx(auVar129,auVar137);
                auVar129 = vpaddd_avx(auVar129,auVar141);
                auVar120 = vpaddd_avx(auVar120,auVar129);
                *(undefined1 (*) [16])(local_728._0_8_ + uVar58 * 0x10) = auVar120;
              }
              local_728._0_8_ = local_728._0_8_ + lVar75 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
        goto LAB_00241e07;
      }
      iVar90 = cpu_support_x86_avx2();
      if (iVar90 == 0) {
        iVar98 = cpu_support_x86_xop();
        iVar95 = local_698.c;
        iVar90 = local_698.elempack;
        if (iVar98 == 0) {
          auVar120._4_4_ = local_5f8.h;
          auVar120._0_4_ = local_5f8.w;
          local_638 = (void *)CONCAT44(local_638._4_4_,local_5f8.c);
          piVar86 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
          local_558.data = local_698.data;
          local_558.refcount._0_4_ = local_698.refcount._0_4_;
          local_558.refcount._4_4_ = local_698.refcount._4_4_;
          local_558.elemsize = local_698.elemsize;
          local_558.elempack = local_698.elempack;
          local_558.allocator = local_698.allocator;
          local_558.d = local_698.d;
          local_558.h = local_698.h;
          local_558.dims = local_698.dims;
          local_558.w = local_698.w;
          local_558.c = local_698.c;
          local_558.cstep = local_698.cstep;
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + 1;
            UNLOCK();
          }
          auVar141._8_4_ = 3;
          auVar141._0_8_ = 0x300000003;
          auVar141._12_4_ = 3;
          auVar120._8_8_ = 0;
          auVar120 = vpaddd_avx(auVar120,auVar141);
          auVar129 = vpsrad_avx(auVar120,0x1f);
          auVar129 = vpsrld_avx(auVar129,0x1e);
          local_728 = vpaddd_avx(auVar120,auVar129);
          auVar132 = ZEXT1664(local_728);
          auVar137._8_4_ = 0xfffffffc;
          auVar137._0_8_ = 0xfffffffcfffffffc;
          auVar137._12_4_ = 0xfffffffc;
          auVar120 = vpand_avx(local_728,auVar137);
          iVar104 = auVar120._0_4_ + 2;
          copy_make_border(&local_698,&local_558,0,(auVar120._4_4_ + 2) - local_698.h,0,
                           iVar104 - local_698.w,0,0.0,opt);
          auVar129 = vpsrad_avx(local_728,2);
          local_618 = CONCAT44(local_618._4_4_,auVar129._0_4_);
          iVar98 = auVar129._0_4_ * 6;
          uVar82 = auVar129._4_4_;
          local_608._0_4_ = iVar98;
          iVar98 = iVar98 * uVar82;
          local_648._0_4_ = iVar98;
          uVar48 = (long)iVar98 / 6;
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          iVar69 = (int)uVar48;
          Mat::create((Mat *)d0,iVar69,0x24,iVar95,(ulong)(uint)(iVar90 * 2),iVar90,
                      opt->workspace_allocator);
          iVar98 = local_698.c;
          lVar91 = (long)(iVar69 * 8);
          lVar75 = (long)(iVar69 << 4);
          asVar78[0] = 0;
          asVar78[1] = 0;
          asVar78[2] = 0;
          asVar78[3] = 0;
          uVar71 = 0;
          if (0 < (int)local_618) {
            uVar71 = local_618 & 0xffffffff;
          }
          local_640[2] = 0;
          local_640[3] = 0;
          local_640[0] = (short)uVar82;
          local_640[1] = (short)(uVar82 >> 0x10);
          if ((int)uVar82 < 1) {
            local_640 = asVar78;
          }
          asVar51[0] = 0;
          asVar51[1] = 0;
          asVar51[2] = 0;
          asVar51[3] = 0;
          if (0 < iVar95) {
            asVar51[2] = 0;
            asVar51[3] = 0;
            local_698.c._0_2_ = (undefined2)iVar95;
            local_698.c._2_2_ = SUB42(iVar95,2);
            asVar51[0] = (undefined2)local_698.c;
            asVar51[1] = local_698.c._2_2_;
          }
          auVar130._8_4_ = 0xfffbfffb;
          auVar130._0_8_ = 0xfffbfffbfffbfffb;
          auVar130._12_4_ = 0xfffbfffb;
          for (; auVar129 = auVar132._0_16_, asVar78 != asVar51;
              asVar78 = (short  [4])((long)asVar78 + 1)) {
            local_728._0_8_ = local_558.data;
            pauVar106 = (undefined1 (*) [16])
                        ((long)local_558.data +
                        local_558.cstep * local_558.elemsize * (long)asVar78 + 0x20);
            asVar77[0] = 0;
            asVar77[1] = 0;
            asVar77[2] = 0;
            asVar77[3] = 0;
            for (; asVar77 != local_640; asVar77 = (short  [4])((long)asVar77 + 1)) {
              local_718._0_2_ = asVar77[0];
              local_718._2_2_ = asVar77[1];
              local_718._4_2_ = asVar77[2];
              local_718._6_2_ = asVar77[3];
              pauVar49 = (undefined1 (*) [16])
                         ((long)((local_608._0_4_ * asVar77._0_4_) / 6) * 0x10 + (long)d0);
              local_728._0_8_ = pauVar106;
              pauVar63 = pauVar106;
              for (uVar109 = 0; lVar57 = -0x60, pauVar61 = pauVar63, uVar109 != uVar71;
                  uVar109 = uVar109 + 1) {
                for (; pauVar54 = pauVar49, lVar101 = 0x50, lVar57 != 0; lVar57 = lVar57 + 0x10) {
                  auVar129 = pauVar61[-2];
                  auVar137 = pauVar61[-1];
                  auVar141 = *pauVar61;
                  auVar131 = vpcmpgtb_avx((undefined1  [16])0x0,auVar129);
                  auVar127 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                  auVar139 = vpcmpgtb_avx((undefined1  [16])0x0,auVar141);
                  auVar142 = vpunpcklbw_avx(auVar129,auVar131);
                  auVar140 = vpunpckhbw_avx(auVar129,auVar131);
                  auVar131 = vpunpcklbw_avx(auVar137,auVar127);
                  auVar127 = vpunpckhbw_avx(auVar137,auVar127);
                  auVar122 = vpunpcklbw_avx(auVar141,auVar139);
                  auVar135 = vpunpckhbw_avx(auVar141,auVar139);
                  auVar129 = vpsllw_avx(auVar142,2);
                  auVar129 = vpaddw_avx(auVar129,auVar122);
                  auVar137 = vpmullw_avx(auVar131,auVar130);
                  auVar129 = vpaddw_avx(auVar129,auVar137);
                  auVar137 = vpaddw_avx(auVar122,auVar127);
                  auVar141 = vpaddw_avx(auVar131,auVar140);
                  auVar141 = vpsllw_avx(auVar141,2);
                  auVar139 = vpsubw_avx(auVar137,auVar141);
                  auVar137 = vpsubw_avx(auVar122,auVar127);
                  auVar141 = vpsubw_avx(auVar140,auVar131);
                  auVar141 = vpsllw_avx(auVar141,2);
                  auVar137 = vpaddw_avx(auVar137,auVar141);
                  auVar131 = vpsubw_avx(auVar122,auVar131);
                  auVar141 = vpsubw_avx(auVar140,auVar127);
                  auVar141 = vpaddw_avx(auVar141,auVar141);
                  auVar142 = vpsubw_avx(auVar131,auVar141);
                  auVar141 = vpaddw_avx(auVar131,auVar141);
                  auVar131 = vpsllw_avx(auVar140,2);
                  auVar131 = vpaddw_avx(auVar131,auVar135);
                  auVar127 = vpmullw_avx(auVar127,auVar130);
                  auVar131 = vpaddw_avx(auVar131,auVar127);
                  auVar132 = ZEXT1664(auVar131);
                  *(undefined1 (*) [16])(auStack_368 + lVar57) = auVar129;
                  *(undefined1 (*) [16])(auStack_308 + lVar57) = auVar139;
                  *(undefined1 (*) [16])(auStack_2a8 + lVar57) = auVar137;
                  *(undefined1 (*) [16])(auStack_248 + lVar57) = auVar142;
                  *(undefined1 (*) [16])(auStack_1e8 + lVar57) = auVar141;
                  *(undefined1 (*) [16])((long)&local_188 + lVar57) = auVar131;
                  pauVar61 = (undefined1 (*) [16])(*pauVar61 + iVar104 * 8);
                }
                for (; lVar101 != 0x290; lVar101 = lVar101 + 0x60) {
                  auVar129 = *(undefined1 (*) [16])((long)local_408 + lVar101);
                  auVar137 = *(undefined1 (*) [16])((long)local_3f8 + lVar101);
                  auVar141 = *(undefined1 (*) [16])(auStack_3e8 + lVar101);
                  auVar131 = *(undefined1 (*) [16])((long)w1 + lVar101);
                  auVar127 = vpsllw_avx(*(undefined1 (*) [16])((long)w2 + lVar101),2);
                  auVar139 = vpmullw_avx(auVar137,auVar130);
                  auVar127 = vpaddw_avx(auVar127,auVar131);
                  auVar127 = vpaddw_avx(auVar139,auVar127);
                  auVar132 = ZEXT1664(auVar127);
                  auVar139 = vpaddw_avx(auVar131,auVar141);
                  auVar142 = vpaddw_avx(auVar137,auVar129);
                  auVar142 = vpsllw_avx(auVar142,2);
                  auVar142 = vpsubw_avx(auVar139,auVar142);
                  auVar139 = vpsubw_avx(auVar131,auVar141);
                  auVar140 = vpsubw_avx(auVar129,auVar137);
                  auVar140 = vpsllw_avx(auVar140,2);
                  auVar139 = vpaddw_avx(auVar140,auVar139);
                  auVar131 = vpsubw_avx(auVar131,auVar137);
                  auVar137 = vpsubw_avx(auVar129,auVar141);
                  auVar137 = vpaddw_avx(auVar137,auVar137);
                  auVar140 = vpsubw_avx(auVar131,auVar137);
                  auVar137 = vpaddw_avx(auVar131,auVar137);
                  auVar131 = vpsllw_avx(auVar129,2);
                  auVar129 = vpmullw_avx(auVar141,auVar130);
                  auVar129 = vpaddw_avx(auVar129,auVar131);
                  auVar129 = vpaddw_avx(auVar129,*(undefined1 (*) [16])(&opt_q.lightmode + lVar101))
                  ;
                  *pauVar54 = auVar127;
                  *(undefined1 (*) [16])(*pauVar54 + lVar91 * 2) = auVar142;
                  *(undefined1 (*) [16])(*pauVar54 + lVar75 * 2) = auVar139;
                  *(undefined1 (*) [16])(*pauVar54 + (long)(iVar69 * 0x18) * 2) = auVar140;
                  *(undefined1 (*) [16])(*pauVar54 + (long)(iVar69 << 5) * 2) = auVar137;
                  *(undefined1 (*) [16])(*pauVar54 + (long)(iVar69 * 0x28) * 2) = auVar129;
                  pauVar54 = (undefined1 (*) [16])(*pauVar54 + (long)(iVar69 * 0x30) * 2);
                }
                pauVar63 = pauVar63 + 2;
                pauVar49 = pauVar49 + 1;
              }
              pauVar106 = (undefined1 (*) [16])
                          (*pauVar106 + (long)local_558.w * local_558.elemsize * 4);
            }
          }
          piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          local_698.c = iVar98;
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_558.cstep = 0;
          local_558.data = (void *)0x0;
          local_558.refcount._0_4_ = 0;
          local_558.refcount._4_4_ = 0;
          local_558.elemsize = 0;
          local_558.elempack = 0;
          local_558.h = 0;
          local_558.d = 0;
          local_558.c = 0;
          local_558.allocator = (Allocator *)0x0;
          local_558.dims = 0;
          local_558.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
          iVar98 = 0;
          if (0xb < (int)local_648._0_4_) {
            iVar98 = (int)((uVar48 & 0xffffffff) >> 1);
          }
          opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
          Mat::create((Mat *)&opt_q,iVar95 << (0xb < (int)local_648._0_4_),iVar69 - iVar98,0x24,
                      (ulong)(uint)(iVar90 * 2),iVar90,opt->workspace_allocator);
          lVar57 = (long)iVar69;
          for (lVar101 = 0; lVar101 != 0x24; lVar101 = lVar101 + 1) {
            lVar93 = (long)(int)opt_q._44_4_ *
                     CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
            for (uVar48 = 0; (long)(uVar48 | 1) < lVar57; uVar48 = uVar48 + 2) {
              puVar84 = (undefined8 *)((uVar48 >> 1) * lVar93 + opt_q._0_8_);
              puVar83 = (undefined8 *)((uVar48 + lVar101 * lVar57) * 0x10 + (long)d0);
              asVar85 = asVar51;
              while (iVar90 = asVar85._0_4_, asVar85._0_4_ = iVar90 - 1, asVar85[2] = 0,
                    asVar85[3] = 0, iVar90 != 0) {
                uVar45 = puVar83[1];
                uVar46 = puVar83[2];
                uVar47 = puVar83[3];
                *puVar84 = *puVar83;
                puVar84[1] = uVar45;
                puVar84[2] = uVar46;
                puVar84[3] = uVar47;
                puVar84 = puVar84 + 4;
              }
            }
            for (; (long)uVar48 < lVar57; uVar48 = uVar48 + 1) {
              puVar84 = (undefined8 *)
                        ((ulong)(((uint)uVar48 & 1) + ((uint)(uVar48 >> 1) & 0x7fffffff)) * lVar93 +
                        opt_q._0_8_);
              puVar83 = (undefined8 *)((uVar48 + lVar101 * lVar57) * 0x10 + (long)d0);
              asVar117 = asVar51;
              while (iVar90 = asVar117._0_4_, asVar117._0_4_ = iVar90 - 1, asVar117[2] = 0,
                    asVar117[3] = 0, iVar90 != 0) {
                uVar45 = puVar83[1];
                *puVar84 = *puVar83;
                puVar84[1] = uVar45;
                puVar84 = puVar84 + 2;
              }
            }
          }
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          auVar132 = ZEXT1664(auVar129);
          Mat::create((Mat *)d1,iVar69,0x24,(int)local_638,0x10,4,opt->workspace_allocator);
          local_628 = (void *)0x0;
          uVar48 = 0;
          if (0 < (int)local_638) {
            local_628 = (void *)((ulong)local_638 & 0xffffffff);
          }
          while (uVar109 = uVar48, auVar129 = auVar132._0_16_, (void *)uVar109 != local_628) {
            sVar5 = (this->weight_winograd43_data).elemsize;
            local_648 = (short  [4])((long)(this->weight_winograd43_data).w * sVar5);
            pvVar72 = (void *)(sVar5 * (this->weight_winograd43_data).cstep * uVar109 +
                              (long)(this->weight_winograd43_data).data);
            asVar78 = d1;
            for (lVar101 = 0; lVar101 != 0x24; lVar101 = lVar101 + 1) {
              lVar93 = opt_q._0_8_;
              for (uVar48 = 0; (long)(uVar48 | 1) < lVar57; uVar48 = uVar48 + 2) {
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                lVar113 = 0;
                auVar136 = ZEXT1664((undefined1  [16])0x0);
                auVar134 = ZEXT1664((undefined1  [16])0x0);
                auVar138 = ZEXT1664((undefined1  [16])0x0);
                asVar116 = asVar51;
                while( true ) {
                  iVar90 = asVar116._0_4_;
                  asVar116._0_4_ = iVar90 - 1;
                  asVar116[2] = 0;
                  asVar116[3] = 0;
                  auVar129 = auVar138._0_16_;
                  if (iVar90 == 0) break;
                  auVar137 = *(undefined1 (*) [16])(lVar93 + lVar113);
                  auVar141 = *(undefined1 (*) [16])(lVar93 + 0x10 + lVar113);
                  auVar130 = *(undefined1 (*) [16])((long)pvVar72 + lVar113 * 2);
                  auVar131 = *(undefined1 (*) [16])((long)pvVar72 + lVar113 * 2 + 0x10);
                  auVar127 = *(undefined1 (*) [16])((long)pvVar72 + lVar113 * 2 + 0x20);
                  auVar140 = vpunpcklwd_avx(auVar137,auVar137);
                  auVar139 = vpshuflw_avx(auVar137,0x50);
                  auVar135 = vpunpcklwd_avx(auVar141,auVar141);
                  auVar142 = vpshuflw_avx(auVar141,0x50);
                  auVar139 = vpshufd_avx(auVar139,0x50);
                  auVar118 = vpmullw_avx(auVar139,auVar130);
                  auVar139 = vpmulhw_avx(auVar139,auVar130);
                  auVar142 = vpshufd_avx(auVar142,0x50);
                  auVar119 = vpmullw_avx(auVar142,auVar130);
                  auVar142 = vpmulhw_avx(auVar142,auVar130);
                  auVar130 = vpshufd_avx(auVar140,0xfa);
                  auVar128 = vpmullw_avx(auVar130,auVar131);
                  auVar140 = vpmulhw_avx(auVar130,auVar131);
                  auVar130 = vpshufd_avx(auVar135,0xfa);
                  auVar121 = vpmullw_avx(auVar130,auVar131);
                  auVar135 = vpmulhw_avx(auVar130,auVar131);
                  auVar130 = vpunpckhwd_avx(auVar137,auVar137);
                  auVar130 = vpshufd_avx(auVar130,0x50);
                  auVar124 = vpmullw_avx(auVar127,auVar130);
                  auVar122 = vpmulhw_avx(auVar127,auVar130);
                  auVar130 = vpunpckhwd_avx(auVar141,auVar141);
                  auVar130 = vpshufd_avx(auVar130,0x50);
                  auVar7 = vpmullw_avx(auVar127,auVar130);
                  auVar123 = vpmulhw_avx(auVar127,auVar130);
                  auVar137 = vpshufhw_avx(auVar137,0xfa);
                  auVar130 = vpshufhw_avx(auVar141,0xfa);
                  auVar141 = vpshufd_avx(auVar137,0xfa);
                  auVar137 = *(undefined1 (*) [16])((long)pvVar72 + lVar113 * 2 + 0x30);
                  auVar8 = vpmullw_avx(auVar137,auVar141);
                  auVar126 = vpmulhw_avx(auVar137,auVar141);
                  auVar141 = vpshufd_avx(auVar130,0xfa);
                  local_718 = vpmullw_avx(auVar137,auVar141);
                  auVar133 = vpmulhw_avx(auVar137,auVar141);
                  auVar137 = vpunpcklwd_avx(auVar118,auVar139);
                  auVar137 = vpaddd_avx(auVar137,auVar129);
                  auVar141 = vpunpckhwd_avx(auVar118,auVar139);
                  auVar141 = vpaddd_avx(auVar141,auVar134._0_16_);
                  auVar130 = vpunpcklwd_avx(auVar119,auVar142);
                  auVar130 = vpaddd_avx(auVar130,auVar136._0_16_);
                  auVar131 = vpunpckhwd_avx(auVar119,auVar142);
                  auVar131 = vpaddd_avx(auVar131,auVar125._0_16_);
                  auVar127 = vpunpcklwd_avx(auVar128,auVar140);
                  auVar139 = vpunpckhwd_avx(auVar128,auVar140);
                  auVar140 = vpunpcklwd_avx(auVar121,auVar135);
                  auVar142 = vpunpckhwd_avx(auVar121,auVar135);
                  auVar135 = vpunpcklwd_avx(auVar124,auVar122);
                  auVar127 = vpaddd_avx(auVar127,auVar135);
                  auVar137 = vpaddd_avx(auVar137,auVar127);
                  auVar127 = vpunpckhwd_avx(auVar124,auVar122);
                  auVar127 = vpaddd_avx(auVar139,auVar127);
                  auVar141 = vpaddd_avx(auVar141,auVar127);
                  auVar127 = vpunpcklwd_avx(auVar7,auVar123);
                  auVar127 = vpaddd_avx(auVar140,auVar127);
                  auVar130 = vpaddd_avx(auVar130,auVar127);
                  auVar127 = vpunpckhwd_avx(auVar7,auVar123);
                  auVar127 = vpaddd_avx(auVar142,auVar127);
                  auVar131 = vpaddd_avx(auVar131,auVar127);
                  auVar132 = ZEXT1664(auVar131);
                  auVar127 = vpunpcklwd_avx(auVar8,auVar126);
                  auVar137 = vpaddd_avx(auVar137,auVar127);
                  auVar138 = ZEXT1664(auVar137);
                  auVar137 = vpunpckhwd_avx(auVar8,auVar126);
                  auVar137 = vpaddd_avx(auVar141,auVar137);
                  auVar134 = ZEXT1664(auVar137);
                  auVar137 = vpunpcklwd_avx(local_718,auVar133);
                  auVar137 = vpaddd_avx(auVar130,auVar137);
                  auVar136 = ZEXT1664(auVar137);
                  auVar137 = vpunpckhwd_avx(local_718,auVar133);
                  auVar137 = vpaddd_avx(auVar131,auVar137);
                  auVar125 = ZEXT1664(auVar137);
                  lVar113 = lVar113 + 0x20;
                  local_728 = auVar129;
                }
                auVar129 = vpaddd_avx(auVar129,auVar134._0_16_);
                auVar137 = vpaddd_avx(auVar136._0_16_,auVar125._0_16_);
                *(undefined1 (*) [16])asVar78 = auVar129;
                *(undefined1 (*) [16])((long)asVar78 + 0x10) = auVar137;
                asVar78 = (short  [4])((long)asVar78 + 0x20);
                lVar93 = lVar93 + CONCAT44(opt_q.workspace_allocator._4_4_,
                                           opt_q.workspace_allocator._0_4_) *
                                  (long)(int)opt_q._44_4_;
              }
              while (uVar82 = (uint)uVar48, (int)uVar82 < iVar69) {
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                lVar93 = 0;
                auVar132 = ZEXT1664((undefined1  [16])0x0);
                asVar110 = asVar51;
                while( true ) {
                  iVar90 = asVar110._0_4_;
                  asVar110._0_4_ = iVar90 - 1;
                  asVar110[2] = 0;
                  asVar110[3] = 0;
                  if (iVar90 == 0) break;
                  auVar129 = *(undefined1 (*) [16])
                              ((ulong)((uVar82 & 1) + ((uint)(uVar48 >> 1) & 0x7fffffff)) *
                               (long)(int)opt_q._44_4_ *
                               CONCAT44(opt_q.workspace_allocator._4_4_,
                                        opt_q.workspace_allocator._0_4_) + opt_q._0_8_ + lVar93);
                  auVar137 = *(undefined1 (*) [16])((long)pvVar72 + lVar93 * 4);
                  auVar141 = *(undefined1 (*) [16])((long)pvVar72 + lVar93 * 4 + 0x10);
                  auVar130 = *(undefined1 (*) [16])((long)pvVar72 + lVar93 * 4 + 0x20);
                  auVar131 = *(undefined1 (*) [16])((long)pvVar72 + lVar93 * 4 + 0x30);
                  auVar139 = vpunpcklwd_avx(auVar129,auVar129);
                  auVar127 = vpshuflw_avx(auVar129,0x50);
                  auVar140 = vpshufhw_avx(auVar129,0xfa);
                  auVar142 = vpunpckhwd_avx(auVar129,auVar129);
                  auVar129 = vpshufd_avx(auVar127,0x50);
                  auVar127 = vpmullw_avx(auVar129,auVar137);
                  auVar137 = vpmulhw_avx(auVar129,auVar137);
                  auVar129 = vpshufd_avx(auVar139,0xfa);
                  auVar139 = vpmullw_avx(auVar141,auVar129);
                  auVar141 = vpmulhw_avx(auVar141,auVar129);
                  auVar129 = vpshufd_avx(auVar142,0x50);
                  auVar142 = vpmullw_avx(auVar130,auVar129);
                  auVar130 = vpmulhw_avx(auVar130,auVar129);
                  auVar129 = vpshufd_avx(auVar140,0xfa);
                  auVar140 = vpmullw_avx(auVar131,auVar129);
                  auVar131 = vpmulhw_avx(auVar131,auVar129);
                  auVar129 = vpunpcklwd_avx(auVar127,auVar137);
                  auVar129 = vpaddd_avx(auVar132._0_16_,auVar129);
                  auVar137 = vpunpckhwd_avx(auVar127,auVar137);
                  auVar137 = vpaddd_avx(auVar125._0_16_,auVar137);
                  auVar135 = vpunpcklwd_avx(auVar139,auVar141);
                  auVar127 = vpunpckhwd_avx(auVar139,auVar141);
                  auVar141 = vpunpcklwd_avx(auVar142,auVar130);
                  auVar141 = vpaddd_avx(auVar135,auVar141);
                  auVar129 = vpaddd_avx(auVar129,auVar141);
                  auVar141 = vpunpckhwd_avx(auVar142,auVar130);
                  auVar141 = vpaddd_avx(auVar127,auVar141);
                  auVar137 = vpaddd_avx(auVar137,auVar141);
                  auVar141 = vpunpcklwd_avx(auVar140,auVar131);
                  auVar129 = vpaddd_avx(auVar129,auVar141);
                  auVar132 = ZEXT1664(auVar129);
                  auVar129 = vpunpckhwd_avx(auVar140,auVar131);
                  auVar129 = vpaddd_avx(auVar137,auVar129);
                  auVar125 = ZEXT1664(auVar129);
                  lVar93 = lVar93 + 0x10;
                }
                auVar129 = vpaddd_avx(auVar132._0_16_,auVar125._0_16_);
                *(undefined1 (*) [16])asVar78 = auVar129;
                asVar78 = (short  [4])((long)asVar78 + 0x10);
                uVar48 = (ulong)(uVar82 + 1);
              }
              pvVar72 = (void *)((long)pvVar72 + (long)local_648);
            }
            local_610 = (void *)uVar109;
            uVar48 = uVar109 + 1;
          }
          piVar86 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                auVar132._8_56_ = extraout_var;
                auVar132._0_8_ = extraout_XMM1_Qa;
                auVar129 = auVar132._0_16_;
              }
            }
          }
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          local_458 = 0;
          opt_b.lightmode = false;
          opt_b._1_3_ = 0;
          opt_b.num_threads = 0;
          opt_b.blob_allocator._0_4_ = 0;
          opt_b.blob_allocator._4_4_ = 0;
          opt_b.workspace_allocator = (Allocator *)0x0;
          opt_b.openmp_blocktime = 0;
          opt_b.use_bf16_storage = false;
          opt_b.use_fp16_packed = false;
          opt_b.use_fp16_storage = false;
          opt_b.use_fp16_arithmetic = false;
          opt_b.use_int8_packed = false;
          opt_b.use_int8_storage = false;
          opt_b.use_int8_arithmetic = false;
          opt_b.use_packing_layout = false;
          opt_b.use_shader_pack8 = false;
          opt_b.use_subgroup_basic = false;
          opt_b.use_subgroup_vote = false;
          opt_b.use_subgroup_ballot = false;
          opt_b.use_subgroup_shuffle = false;
          opt_b.use_image_storage = false;
          opt_b.use_tensor_storage = false;
          opt_b.use_reserved_0 = false;
          opt_b.flush_denormals = 0;
          opt_b.use_local_pool_allocator = false;
          opt_b.use_shader_local_memory = false;
          opt_b.use_cooperative_matrix = false;
          opt_b.use_winograd23_convolution = false;
          opt_b.use_winograd43_convolution = false;
          opt_b.use_winograd63_convolution = false;
          opt_b.use_reserved_6 = false;
          opt_b.use_reserved_7 = false;
          auVar131._4_4_ = local_5f8.h;
          auVar131._0_4_ = local_5f8.w;
          auVar131._8_8_ = 0;
          auVar137 = vpcmpeqd_avx(auVar131,auVar120);
          auVar137 = vpmovsxdq_avx(auVar137);
          auVar129 = vpcmpeqd_avx(auVar129,auVar129);
          if (((auVar129 & ~auVar137) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              -1 < SUB161(auVar129 & ~auVar137,0xf)) {
            piVar86 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
            if (piVar86 != (int *)0x0) {
              LOCK();
              *piVar86 = *piVar86 + 1;
              UNLOCK();
            }
            opt_b._0_8_ = local_5f8.data;
            opt_b.blob_allocator._0_4_ = local_5f8.refcount._0_4_;
            opt_b.blob_allocator._4_4_ = local_5f8.refcount._4_4_;
            opt_b.workspace_allocator = (Allocator *)local_5f8.elemsize;
            opt_b.openmp_blocktime = local_5f8.elempack;
            opt_b._32_8_ = local_5f8.allocator;
            opt_b.use_shader_pack8 = (bool)(undefined1)local_5f8.dims;
            opt_b.use_subgroup_basic = (bool)local_5f8.dims._1_1_;
            opt_b.use_subgroup_vote = (bool)local_5f8.dims._2_1_;
            opt_b.use_subgroup_ballot = (bool)local_5f8.dims._3_1_;
            opt_b.use_subgroup_shuffle = (bool)(undefined1)local_5f8.w;
            opt_b.use_image_storage = (bool)local_5f8.w._1_1_;
            opt_b.use_tensor_storage = (bool)local_5f8.w._2_1_;
            opt_b.use_reserved_0 = (bool)local_5f8.w._3_1_;
            opt_b.flush_denormals = local_5f8.h;
            opt_b.use_local_pool_allocator = (bool)(undefined1)local_5f8.d;
            opt_b.use_shader_local_memory = (bool)local_5f8.d._1_1_;
            opt_b.use_cooperative_matrix = (bool)local_5f8.d._2_1_;
            opt_b.use_winograd23_convolution = (bool)local_5f8.d._3_1_;
            opt_b.use_winograd43_convolution = (bool)(undefined1)local_5f8.c;
            opt_b.use_winograd63_convolution = (bool)local_5f8.c._1_1_;
            opt_b.use_reserved_6 = (bool)local_5f8.c._2_1_;
            opt_b.use_reserved_7 = (bool)local_5f8.c._3_1_;
            local_458 = local_5f8.cstep;
          }
          else {
            Mat::create((Mat *)&opt_b,auVar120._0_4_,auVar120._4_4_,(int)local_638,0x10,4,
                        opt->workspace_allocator);
          }
          for (uVar48 = 0; (void *)uVar48 != local_628; uVar48 = uVar48 + 1) {
            local_718._0_2_ = d1[0];
            local_718._2_2_ = d1[1];
            local_718._4_2_ = d1[2];
            local_718._6_2_ = d1[3];
            pauVar106 = (undefined1 (*) [16])
                        (opt_b._0_8_ + local_458 * (long)opt_b.workspace_allocator * uVar48 + 0x30);
            asVar107[0] = 0;
            asVar107[1] = 0;
            asVar107[2] = 0;
            asVar107[3] = 0;
            for (; asVar107 != local_640; asVar107 = (short  [4])((long)asVar107 + 1)) {
              pauVar49 = (undefined1 (*) [16])
                         ((long)((local_608._0_4_ * asVar107._0_4_) / 6) * 0x10 + (long)d1);
              local_728._0_8_ = pauVar106;
              pauVar63 = pauVar106;
              for (uVar109 = 0; lVar57 = -0x50, pauVar61 = pauVar49, uVar109 != uVar71;
                  uVar109 = uVar109 + 1) {
                for (; lVar57 != 0; lVar57 = lVar57 + 0x10) {
                  auVar120 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar61 + lVar91 * 4),
                                        *(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 4) * 4));
                  auVar130 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 4) * 4),
                                        *(undefined1 (*) [16])(*pauVar61 + lVar91 * 4));
                  auVar129 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar61 + lVar75 * 4),
                                        *(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0xc) * 4)
                                       );
                  auVar137 = vpaddd_avx(auVar120,*pauVar61);
                  auVar131 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0xc) * 4)
                                        ,*(undefined1 (*) [16])(*pauVar61 + lVar75 * 4));
                  auVar137 = vpaddd_avx(auVar137,auVar129);
                  auVar141 = vpaddd_avx(auVar131,auVar131);
                  auVar141 = vpaddd_avx(auVar141,auVar130);
                  auVar129 = vpslld_avx(auVar129,2);
                  auVar120 = vpaddd_avx(auVar129,auVar120);
                  auVar129 = vpslld_avx(*(undefined1 (*) [16])
                                         (*pauVar61 + (long)(iVar69 * 0x14) * 4),2);
                  auVar129 = vpaddd_avx(auVar129,auVar130);
                  auVar130 = vpslld_avx(auVar131,3);
                  auVar129 = vpaddd_avx(auVar129,auVar130);
                  *(undefined1 (*) [16])(local_378 + lVar57) = auVar137;
                  *(undefined1 (*) [16])(local_318 + lVar57) = auVar141;
                  *(undefined1 (*) [16])(local_2b8 + lVar57) = auVar120;
                  *(undefined1 (*) [16])(local_258 + lVar57) = auVar129;
                  pauVar61 = (undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0x18) * 4);
                }
                auVar129 = vpslld_avx(*(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0x14) * 4),
                                      4);
                auVar120 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 4) * 4),
                                      *(undefined1 (*) [16])(*pauVar61 + lVar91 * 4));
                auVar130 = vpslld_avx(auVar120,2);
                auVar120 = vpaddd_avx(auVar130,auVar129);
                auVar137 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0xc) * 4),
                                      *(undefined1 (*) [16])(*pauVar61 + lVar75 * 4));
                auVar129 = vpslld_avx(auVar137,5);
                local_258 = vpaddd_avx(auVar129,auVar120);
                auVar120 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar61 + lVar75 * 4),
                                      *(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 0xc) * 4));
                auVar131 = vpslld_avx(auVar120,4);
                auVar129 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar61 + lVar91 * 4),
                                      *(undefined1 (*) [16])(*pauVar61 + (long)(iVar69 * 4) * 4));
                auVar141 = vpslld_avx(auVar129,2);
                local_2b8 = vpaddd_avx(auVar131,auVar141);
                auVar137 = vpslld_avx(auVar137,3);
                local_318 = vpaddd_avx(auVar137,auVar130);
                auVar129 = vpaddd_avx(auVar129,*pauVar61);
                auVar120 = vpaddd_avx(auVar129,auVar120);
                local_378 = vpslld_avx(auVar120,2);
                pauVar61 = pauVar63;
                for (lVar57 = 0x50; lVar57 != 0x1d0; lVar57 = lVar57 + 0x60) {
                  auVar120 = vpaddd_avx(*(undefined1 (*) [16])((long)local_3f8 + lVar57),
                                        *(undefined1 (*) [16])((long)local_408 + lVar57));
                  auVar130 = vpsubd_avx(*(undefined1 (*) [16])((long)local_408 + lVar57),
                                        *(undefined1 (*) [16])((long)local_3f8 + lVar57));
                  auVar129 = vpaddd_avx(*(undefined1 (*) [16])((long)w1 + lVar57),
                                        *(undefined1 (*) [16])(auStack_3e8 + lVar57));
                  auVar137 = vpaddd_avx(auVar120,*(undefined1 (*) [16])((long)w2 + lVar57));
                  auVar131 = vpsubd_avx(*(undefined1 (*) [16])(auStack_3e8 + lVar57),
                                        *(undefined1 (*) [16])((long)w1 + lVar57));
                  auVar137 = vpaddd_avx(auVar137,auVar129);
                  auVar141 = vpaddd_avx(auVar131,auVar131);
                  auVar141 = vpaddd_avx(auVar141,auVar130);
                  auVar129 = vpslld_avx(auVar129,2);
                  auVar129 = vpaddd_avx(auVar129,auVar120);
                  auVar120 = vpaddd_avx(auVar130,*(undefined1 (*) [16])(&opt_q.lightmode + lVar57));
                  auVar130 = vpslld_avx(auVar131,3);
                  auVar130 = vpaddd_avx(auVar120,auVar130);
                  auVar120 = vcvtdq2ps_avx(auVar137);
                  auVar142._0_4_ = (int)(auVar120._0_4_ * 0.0017361111);
                  auVar142._4_4_ = (int)(auVar120._4_4_ * 0.0017361111);
                  auVar142._8_4_ = (int)(auVar120._8_4_ * 0.0017361111);
                  auVar142._12_4_ = (int)(auVar120._12_4_ * 0.0017361111);
                  auVar120 = vcvtdq2ps_avx(auVar141);
                  auVar140._0_4_ = (int)(auVar120._0_4_ * 0.0017361111);
                  auVar140._4_4_ = (int)(auVar120._4_4_ * 0.0017361111);
                  auVar140._8_4_ = (int)(auVar120._8_4_ * 0.0017361111);
                  auVar140._12_4_ = (int)(auVar120._12_4_ * 0.0017361111);
                  auVar120 = vcvtdq2ps_avx(auVar129);
                  auVar139._0_4_ = (int)(auVar120._0_4_ * 0.0017361111);
                  auVar139._4_4_ = (int)(auVar120._4_4_ * 0.0017361111);
                  auVar139._8_4_ = (int)(auVar120._8_4_ * 0.0017361111);
                  auVar139._12_4_ = (int)(auVar120._12_4_ * 0.0017361111);
                  auVar120 = vcvtdq2ps_avx(auVar130);
                  auVar127._0_4_ = (int)(auVar120._0_4_ * 0.0017361111);
                  auVar127._4_4_ = (int)(auVar120._4_4_ * 0.0017361111);
                  auVar127._8_4_ = (int)(auVar120._8_4_ * 0.0017361111);
                  auVar127._12_4_ = (int)(auVar120._12_4_ * 0.0017361111);
                  pauVar61[-3] = auVar142;
                  pauVar61[-2] = auVar140;
                  pauVar61[-1] = auVar139;
                  *pauVar61 = auVar127;
                  pauVar61 = (undefined1 (*) [16])(*pauVar61 + (long)((int)local_618 << 4) * 4);
                }
                pauVar49 = pauVar49 + 1;
                pauVar63 = pauVar63 + 4;
              }
              pauVar106 = (undefined1 (*) [16])
                          (*pauVar106 +
                          (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4);
            }
          }
          copy_cut_border((Mat *)&opt_b,&local_5f8,0,opt_b.flush_denormals - local_5f8.h,0,
                          opt_b._44_4_ - local_5f8.w,opt);
          piVar86 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (opt_b._32_8_ == 0) {
                free((void *)opt_b._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
              }
            }
          }
          piVar86 = (int *)CONCAT44(local_558.refcount._4_4_,local_558.refcount._0_4_);
          if (piVar86 != (int *)0x0) {
            LOCK();
            *piVar86 = *piVar86 + -1;
            UNLOCK();
            if (*piVar86 == 0) {
              if (local_558.allocator == (Allocator *)0x0) {
                free(local_558.data);
              }
              else {
                (*(local_558.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_00241e07;
        }
        conv3x3s1_winograd43_pack8to4_int8_sse_xop
                  (&local_698,&local_5f8,&this->weight_winograd43_data,opt);
      }
      else {
        conv3x3s1_winograd43_pack8to4_int8_sse_avx2
                  (&local_698,&local_5f8,&this->weight_winograd43_data,opt);
      }
    }
LAB_002440af:
    p_Var3 = this->_vptr_Convolution_x86_avx[-3];
    if (local_3dc < 0x65) {
      dequantize_from_int32
                (&local_5f8,local_3f0,&this->scale_in_data,
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->scale_in_data).data),opt);
      pLVar4 = this->activation;
      iVar90 = 0;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,local_3f0,opt);
      }
    }
    else {
      iVar90 = 0;
      requantize_from_int32_to_int8
                (&local_5f8,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var3),
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->scale_in_data).data),
                 *(int *)(p_Var3 + 0x24 + (long)&(this->weight_winograd43_data).data),
                 (Mat *)(p_Var3 + 0x28 + (long)&(this->weight_winograd43_data).data),opt);
    }
  }
  piVar86 = (int *)CONCAT44(local_5f8.refcount._4_4_,local_5f8.refcount._0_4_);
  if (piVar86 != (int *)0x0) {
    LOCK();
    *piVar86 = *piVar86 + -1;
    UNLOCK();
    if (*piVar86 == 0) {
      if (local_5f8.allocator == (Allocator *)0x0) {
        free(local_5f8.data);
      }
      else {
        (*(local_5f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00244190:
  piVar86 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
  if (piVar86 != (int *)0x0) {
    LOCK();
    *piVar86 = *piVar86 + -1;
    UNLOCK();
    if (*piVar86 == 0) {
      if (local_698.allocator == (Allocator *)0x0) {
        free(local_698.data);
      }
      else {
        (*(local_698.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_148.refcount != (int *)0x0) {
    LOCK();
    *local_148.refcount = *local_148.refcount + -1;
    UNLOCK();
    if (*local_148.refcount == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar90;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}